

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

void __thiscall
slang::ast::Compilation::Compilation(Compilation *this,Bag *options,SourceLibrary *defaultLib)

{
  flat_hash_map<syntax::SyntaxKind,_const_Type_*> *this_00;
  size_t *psVar1;
  group_type_pointer pgVar2;
  group_type_pointer pgVar3;
  group_type_pointer pgVar4;
  group15<boost::unordered::detail::foa::plain_integral> *pgVar5;
  group_type_pointer pgVar6;
  Type *pTVar7;
  group_type_pointer pgVar8;
  void *pvVar9;
  RootSymbol *p;
  size_t __n;
  char *__s1;
  uint uVar10;
  flat_hash_map<std::tuple<DiagCode,_SourceLocation>,_std::vector<Diagnostic>_> *pfVar11;
  flat_hash_map<const_syntax::SyntaxNode_*,_std::pair<ConstantValue,_const_syntax::SyntaxNode_*>_>
  *pfVar12;
  flat_hash_map<OpaqueInstancePath::Entry,_HierarchyOverrideNode> *pfVar13;
  vector<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_>_>
  *pvVar14;
  undefined4 uVar15;
  bitmask<slang::ast::IntegralFlags> bVar16;
  int iVar17;
  pointer __p;
  ulong uVar18;
  NetType *pNVar19;
  RootSymbol *thisSym_;
  PackageSymbol *pPVar20;
  long *plVar21;
  uint uVar22;
  size_t sVar23;
  group_type_pointer pgVar24;
  SourceLibrary *pSVar25;
  Compilation *pCVar26;
  value_type_pointer ppVar27;
  value_type_pointer ppVar28;
  value_type_pointer ppVar29;
  value_type_pointer pbVar30;
  value_type_pointer ppVar31;
  value_type_pointer ppVar32;
  value_type_pointer ppVar33;
  value_type_pointer ppVar34;
  value_type_pointer ppVar35;
  value_type_pointer ppVar36;
  value_type_pointer ppVar37;
  value_type_pointer ppVar38;
  value_type_pointer ppVar39;
  value_type_pointer ppVar40;
  value_type_pointer ppVar41;
  value_type_pointer ppVar42;
  value_type_pointer ppVar43;
  value_type_pointer ppVar44;
  value_type_pointer ppVar45;
  value_type_pointer ppVar46;
  value_type_pointer ppVar47;
  value_type_pointer ppVar48;
  value_type_pointer ppVar49;
  value_type_pointer ppVar50;
  value_type_pointer ppVar51;
  ulong uVar52;
  long lVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  value_type_pointer ppVar57;
  value_type_pointer ppVar58;
  long *in_FS_OFFSET;
  bool bVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  uchar uVar74;
  uchar uVar101;
  uchar uVar102;
  uchar uVar103;
  uchar uVar104;
  uchar uVar105;
  uchar uVar106;
  uchar uVar107;
  uchar uVar108;
  uchar uVar109;
  uchar uVar110;
  uchar uVar111;
  uchar uVar112;
  uchar uVar113;
  uchar uVar114;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  uchar uVar115;
  string_view sVar116;
  locator res;
  value_type *elements_39;
  value_type *elements_38;
  try_emplace_args_t local_171;
  Compilation *local_170;
  basic_string_view<char,_std::char_traits<char>_> local_168;
  undefined1 local_158 [20];
  uint uStack_144;
  long lStack_140;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::parsing::TokenKind,_void>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
  *local_138;
  basic_string_view<char,_std::char_traits<char>_> *local_130;
  undefined8 local_128;
  uchar uStack_120;
  uchar uStack_11f;
  uchar uStack_11e;
  uchar uStack_11d;
  uchar uStack_11c;
  uchar uStack_11b;
  uchar uStack_11a;
  uchar uStack_119;
  TypedBumpAllocator<slang::ast::GenericClassDefSymbol> *local_118;
  SourceLibrary *local_110;
  uint64_t local_108;
  PackageSymbol **local_100;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *local_f8;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *local_f0;
  TypedBumpAllocator<slang::ast::AssertionInstanceDetails> *local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  group_type_pointer local_c8;
  value_type_pointer local_c0;
  default_delete<slang::SourceLibrary> *local_b8;
  TypedBumpAllocator<slang::ast::ConfigBlockSymbol> *local_b0;
  TypedBumpAllocator<slang::ConstantValue> *local_a8;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  *local_a0;
  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  *local_98;
  vector<std::shared_ptr<slang::ast::SystemSubroutine>,_std::allocator<std::shared_ptr<slang::ast::SystemSubroutine>_>_>
  *local_90;
  undefined8 local_88;
  uchar uStack_80;
  uchar uStack_7f;
  uchar uStack_7e;
  uchar uStack_7d;
  uchar uStack_7c;
  uchar uStack_7b;
  uchar uStack_7a;
  uchar uStack_79;
  size_t local_70;
  SourceLibrary *local_68;
  Diagnostic *local_60;
  TypedBumpAllocator<slang::ast::Scope::WildcardImportData> *local_58;
  TypedBumpAllocator<boost::unordered::unordered_flat_map<unsigned_long,_unsigned_long,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
  *local_50;
  TypedBumpAllocator<boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
  *local_48;
  CompilationOptions *local_40;
  SafeIndexedVector<slang::ast::Scope::DeferredMemberData,_slang::ast::Scope::DeferredMemberIndex>
  *local_38;
  
  BumpAllocator::BumpAllocator(&this->super_BumpAllocator);
  local_170 = this;
  Bag::getOrDefault<slang::ast::CompilationOptions>(&this->options,options);
  BumpAllocator::BumpAllocator(&(this->symbolMapAllocator).super_BumpAllocator);
  BumpAllocator::BumpAllocator(&(this->pointerMapAllocator).super_BumpAllocator);
  BumpAllocator::BumpAllocator(&(this->constantAllocator).super_BumpAllocator);
  (this->driverMapAllocator).alloc = &this->super_BumpAllocator;
  (this->driverMapAllocator).freeList = (FreeNode *)0x0;
  (this->unrollIntervalMapAllocator).alloc = &this->super_BumpAllocator;
  *(undefined1 (*) [16])&(this->unrollIntervalMapAllocator).freeList = (undefined1  [16])0x0;
  this->scalarTypeTable[1] = (Type *)0x0;
  this->scalarTypeTable[2] = (Type *)0x0;
  this->scalarTypeTable[3] = (Type *)0x0;
  this->scalarTypeTable[4] = (Type *)0x0;
  this->scalarTypeTable[5] = (Type *)0x0;
  this->scalarTypeTable[6] = (Type *)0x0;
  this->scalarTypeTable[7] = (Type *)0x0;
  local_38 = &this->deferredData;
  local_a8 = &this->constantAllocator;
  SafeIndexedVector<slang::ast::Scope::DeferredMemberData,_slang::ast::Scope::DeferredMemberIndex>::
  SafeIndexedVector(local_38);
  (this->referenceStatusMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<bool,_bool>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<bool,_bool>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->referenceStatusMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<bool,_bool>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<bool,_bool>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->referenceStatusMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<bool,_bool>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<bool,_bool>_>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->referenceStatusMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<bool,_bool>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<bool,_bool>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->referenceStatusMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<bool,_bool>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<bool,_bool>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  ppVar27 = (this->referenceStatusMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<bool,_bool>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<bool,_bool>_>_>_>
            .arrays.elements_;
  sVar23 = 0x1d;
  if (ppVar27 != (value_type_pointer)0x0) {
    ppVar27 = (value_type_pointer)0x1d;
  }
  (this->referenceStatusMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<bool,_bool>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<bool,_bool>_>_>_>
  .size_ctrl.ml = (size_t)ppVar27;
  (this->referenceStatusMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<bool,_bool>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<bool,_bool>_>_>_>
  .size_ctrl.size = 0;
  (this->definitionMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->definitionMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->definitionMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->definitionMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->definitionMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  ppVar42 = (this->definitionMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
            .arrays.elements_;
  if (ppVar42 != (value_type_pointer)0x0) {
    ppVar42 = (value_type_pointer)0x1d;
  }
  (this->definitionMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
  .size_ctrl.ml = (size_t)ppVar42;
  (this->definitionMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
  .size_ctrl.size = 0;
  (this->vectorTypeCache).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->vectorTypeCache).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
  .arrays.groups_size_mask = 1;
  (this->vectorTypeCache).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->vectorTypeCache).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->vectorTypeCache).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  ppVar43 = (this->vectorTypeCache).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
            .arrays.elements_;
  if (ppVar43 != (value_type_pointer)0x0) {
    ppVar43 = (value_type_pointer)0x1d;
  }
  (this->vectorTypeCache).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
  .size_ctrl.ml = (size_t)ppVar43;
  (this->vectorTypeCache).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
  .size_ctrl.size = 0;
  (this->knownTypes).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->knownTypes).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
  .arrays.groups_size_mask = 1;
  (this->knownTypes).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->knownTypes).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->knownTypes).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  ppVar44 = (this->knownTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
            .arrays.elements_;
  if (ppVar44 != (value_type_pointer)0x0) {
    ppVar44 = (value_type_pointer)0x1d;
  }
  (this->knownTypes).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
  .size_ctrl.ml = (size_t)ppVar44;
  (this->knownTypes).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
  .size_ctrl.size = 0;
  local_138 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::parsing::TokenKind,_void>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
               *)&this->knownNetTypes;
  (this->knownNetTypes).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->knownNetTypes).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->knownNetTypes).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->knownNetTypes).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->knownNetTypes).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  ppVar45 = (this->knownNetTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
            .arrays.elements_;
  if (ppVar45 != (value_type_pointer)0x0) {
    ppVar45 = (value_type_pointer)0x1d;
  }
  (this->knownNetTypes).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
  .size_ctrl.ml = (size_t)ppVar45;
  (this->knownNetTypes).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
  .size_ctrl.size = 0;
  (this->packageMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->packageMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
  .arrays.groups_size_mask = 1;
  (this->packageMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->packageMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->packageMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  ppVar46 = (this->packageMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
            .arrays.elements_;
  if (ppVar46 != (value_type_pointer)0x0) {
    ppVar46 = (value_type_pointer)0x1d;
  }
  local_f0 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)&this->packageMap;
  (this->packageMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
  .size_ctrl.ml = (size_t)ppVar46;
  (this->systemSubroutines).
  super__Vector_base<std::shared_ptr<slang::ast::SystemSubroutine>,_std::allocator<std::shared_ptr<slang::ast::SystemSubroutine>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->systemSubroutines).
  super__Vector_base<std::shared_ptr<slang::ast::SystemSubroutine>,_std::allocator<std::shared_ptr<slang::ast::SystemSubroutine>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->packageMap).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
    .size_ctrl.size = (undefined1  [16])0x0;
  (this->methodMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->methodMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->methodMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->methodMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->methodMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  ppVar47 = (this->methodMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
            .arrays.elements_;
  if (ppVar47 != (value_type_pointer)0x0) {
    ppVar47 = (value_type_pointer)0x1d;
  }
  (this->methodMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  .size_ctrl.ml = (size_t)ppVar47;
  (this->methodMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  .size_ctrl.size = 0;
  (this->instanceSideEffectMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->instanceSideEffectMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->instanceSideEffectMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->instanceSideEffectMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->instanceSideEffectMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  ppVar48 = (this->instanceSideEffectMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
            .arrays.elements_;
  if (ppVar48 != (value_type_pointer)0x0) {
    ppVar48 = (value_type_pointer)0x1d;
  }
  (this->instanceSideEffectMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
  .size_ctrl.ml = (size_t)ppVar48;
  (this->instanceSideEffectMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
  .size_ctrl.size = 0;
  (this->attributeMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->attributeMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->attributeMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->attributeMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->attributeMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  ppVar49 = (this->attributeMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
            .arrays.elements_;
  if (ppVar49 != (value_type_pointer)0x0) {
    ppVar49 = (value_type_pointer)0x1d;
  }
  local_90 = &this->systemSubroutines;
  (this->attributeMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
  .size_ctrl.ml = (size_t)ppVar49;
  (this->attributeMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
  .size_ctrl.size = 0;
  (this->syntaxMetadata).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->syntaxMetadata).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
  .arrays.groups_size_mask = 1;
  (this->syntaxMetadata).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->syntaxMetadata).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->syntaxMetadata).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  ppVar50 = (this->syntaxMetadata).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
            .arrays.elements_;
  if (ppVar50 != (value_type_pointer)0x0) {
    ppVar50 = (value_type_pointer)0x1d;
  }
  (this->syntaxMetadata).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
  .size_ctrl.ml = (size_t)ppVar50;
  (this->definitionMemory).
  super__Vector_base<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>,_std::allocator<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->definitionMemory).
  super__Vector_base<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>,_std::allocator<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->syntaxMetadata).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
    .size_ctrl.size = (undefined1  [16])0x0;
  (this->diagMap).map.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->diagMap).map.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>_>_>
  .arrays.groups_size_mask = 1;
  pfVar11 = &(this->diagMap).map;
  (pfVar11->table_).
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (pfVar11->table_).
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->diagMap).map.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  ppVar51 = (this->diagMap).map.table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>_>_>
            .arrays.elements_;
  if (ppVar51 != (value_type_pointer)0x0) {
    ppVar51 = (value_type_pointer)0x1d;
  }
  (this->diagMap).map.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>_>_>
  .size_ctrl.ml = (size_t)ppVar51;
  (this->hierarchicalAssignments).
  super__Vector_base<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->hierarchicalAssignments).
  super__Vector_base<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->virtualInterfaceInstances).
    super__Vector_base<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->virtualInterfaceInstances).
  super__Vector_base<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->virtualInterfaceInstances).
  super__Vector_base<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->defaultLiblist).
  super__Vector_base<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->defaultLiblist).
  super__Vector_base<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->diagMap).map.table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>_>_>
    .size_ctrl.size = (undefined1  [16])0x0;
  (this->outOfBlockDecls).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->outOfBlockDecls).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->outOfBlockDecls).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->outOfBlockDecls).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->outOfBlockDecls).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  if ((this->outOfBlockDecls).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
      .arrays.elements_ == (value_type_pointer)0x0) {
    sVar23 = 0;
  }
  local_98 = (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
              *)&this->methodMap;
  (this->outOfBlockDecls).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
  .size_ctrl.ml = sVar23;
  *(undefined8 *)((long)&this->numErrors + 5) = 0;
  this->sourceManager = (SourceManager *)0x0;
  this->numErrors = 0;
  *(undefined1 (*) [16])
   &(this->outOfBlockDecls).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
    .size_ctrl.size = (undefined1  [16])0x0;
  this->typoCorrections = 0;
  this->nextEnumSystemId = 1;
  this->nextStructSystemId = 1;
  this->nextUnionSystemId = 1;
  local_118 = &this->genericClassAllocator;
  local_50 = &this->pointerMapAllocator;
  local_48 = &this->symbolMapAllocator;
  local_40 = &this->options;
  BumpAllocator::BumpAllocator(&local_118->super_BumpAllocator);
  local_e8 = &this->assertionDetailsAllocator;
  BumpAllocator::BumpAllocator(&local_e8->super_BumpAllocator);
  local_b0 = &this->configBlockAllocator;
  BumpAllocator::BumpAllocator(&local_b0->super_BumpAllocator);
  local_58 = &this->wildcardImportAllocator;
  BumpAllocator::BumpAllocator(&local_58->super_BumpAllocator);
  this_00 = &this->knownTypes;
  local_60 = &this->tempDiag;
  Diagnostic::Diagnostic(local_60,(DiagCode)0x0,(SourceLocation)0x0);
  (this->cachedParseDiagnostics).super__Optional_base<slang::Diagnostics,_false,_false>._M_payload.
  super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
  super__Optional_payload_base<slang::Diagnostics>._M_engaged = false;
  (this->cachedSemanticDiagnostics).super__Optional_base<slang::Diagnostics,_false,_false>.
  _M_payload.super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
  super__Optional_payload_base<slang::Diagnostics>._M_engaged = false;
  (this->cachedAllDiagnostics).super__Optional_base<slang::Diagnostics,_false,_false>._M_payload.
  super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
  super__Optional_payload_base<slang::Diagnostics>._M_engaged = false;
  (this->compilationUnits).
  super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->compilationUnits).
  super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->compilationUnits).
    super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->syntaxTrees).
  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->syntaxTrees).
  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->unreferencedDefs).
  super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->unreferencedDefs).
  super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->unreferencedDefs).
  super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->gateMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->gateMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>_>_>
  .arrays.groups_size_mask = 1;
  (this->gateMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->gateMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->gateMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  ppVar28 = (this->gateMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>_>_>
            .arrays.elements_;
  sVar23 = 0x1d;
  if (ppVar28 != (value_type_pointer)0x0) {
    ppVar28 = (value_type_pointer)0x1d;
  }
  (this->gateMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>_>_>
  .size_ctrl.ml = (size_t)ppVar28;
  (this->gateMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>_>_>
  .size_ctrl.size = 0;
  (this->definitionFromSyntax).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->definitionFromSyntax).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->definitionFromSyntax).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->definitionFromSyntax).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->definitionFromSyntax).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  ppVar29 = (this->definitionFromSyntax).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
            .arrays.elements_;
  if (ppVar29 != (value_type_pointer)0x0) {
    ppVar29 = (value_type_pointer)0x1d;
  }
  (this->definitionFromSyntax).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
  .size_ctrl.ml = (size_t)ppVar29;
  (this->definitionFromSyntax).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
  .size_ctrl.size = 0;
  (this->globalInstantiations).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->globalInstantiations).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.groups_size_mask = 1;
  (this->globalInstantiations).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->globalInstantiations).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->globalInstantiations).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  pbVar30 = (this->globalInstantiations).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
            .arrays.elements_;
  if (pbVar30 != (value_type_pointer)0x0) {
    pbVar30 = (value_type_pointer)0x1d;
  }
  (this->globalInstantiations).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .size_ctrl.ml = (size_t)pbVar30;
  (this->globalInstantiations).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .size_ctrl.size = 0;
  (this->hierarchyOverrides).paramOverrides.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->hierarchyOverrides).paramOverrides.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
  .arrays.groups_size_mask = 1;
  pfVar12 = &(this->hierarchyOverrides).paramOverrides;
  (pfVar12->table_).
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (pfVar12->table_).
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->hierarchyOverrides).paramOverrides.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  ppVar31 = (this->hierarchyOverrides).paramOverrides.table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
            .arrays.elements_;
  if (ppVar31 != (value_type_pointer)0x0) {
    ppVar31 = (value_type_pointer)0x1d;
  }
  (this->hierarchyOverrides).paramOverrides.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
  .size_ctrl.ml = (size_t)ppVar31;
  (this->hierarchyOverrides).paramOverrides.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
  .size_ctrl.size = 0;
  (this->hierarchyOverrides).childNodes.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->hierarchyOverrides).childNodes.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
  .arrays.groups_size_mask = 1;
  pfVar13 = &(this->hierarchyOverrides).childNodes;
  (pfVar13->table_).
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (pfVar13->table_).
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->hierarchyOverrides).childNodes.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  ppVar32 = (this->hierarchyOverrides).childNodes.table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
            .arrays.elements_;
  if (ppVar32 != (value_type_pointer)0x0) {
    ppVar32 = (value_type_pointer)0x1d;
  }
  (this->hierarchyOverrides).childNodes.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
  .size_ctrl.ml = (size_t)ppVar32;
  (this->nameConflicts).
  super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nameConflicts).
  super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->externInterfaceMethods).
    super__Vector_base<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->externInterfaceMethods).
  super__Vector_base<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->externInterfaceMethods).
  super__Vector_base<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bindDirectives).
  super__Vector_base<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bindDirectives).
  super__Vector_base<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->dpiExports).
    super__Vector_base<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->dpiExports).
  super__Vector_base<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dpiExports).
  super__Vector_base<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pvVar14 = &(this->hierarchyOverrides).binds;
  (pvVar14->
  super__Vector_base<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar14->
  super__Vector_base<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->hierarchyOverrides).childNodes.table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
    .size_ctrl.size = (undefined1  [16])0x0;
  (this->defaultClockingMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->defaultClockingMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
  .arrays.groups_size_mask = 1;
  (this->defaultClockingMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->defaultClockingMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->defaultClockingMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  ppVar33 = (this->defaultClockingMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
            .arrays.elements_;
  if (ppVar33 != (value_type_pointer)0x0) {
    ppVar33 = (value_type_pointer)0x1d;
  }
  (this->defaultClockingMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
  .size_ctrl.ml = (size_t)ppVar33;
  (this->defaultClockingMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
  .size_ctrl.size = 0;
  (this->globalClockingMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->globalClockingMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*>_>_>
  .arrays.groups_size_mask = 1;
  (this->globalClockingMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->globalClockingMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->globalClockingMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  ppVar34 = (this->globalClockingMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*>_>_>
            .arrays.elements_;
  if (ppVar34 != (value_type_pointer)0x0) {
    ppVar34 = (value_type_pointer)0x1d;
  }
  (this->globalClockingMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*>_>_>
  .size_ctrl.ml = (size_t)ppVar34;
  (this->globalClockingMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*>_>_>
  .size_ctrl.size = 0;
  (this->defaultDisableMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->defaultDisableMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
  .arrays.groups_size_mask = 1;
  (this->defaultDisableMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->defaultDisableMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->defaultDisableMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  ppVar35 = (this->defaultDisableMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
            .arrays.elements_;
  if (ppVar35 != (value_type_pointer)0x0) {
    ppVar35 = (value_type_pointer)0x1d;
  }
  (this->defaultDisableMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
  .size_ctrl.ml = (size_t)ppVar35;
  (this->defaultDisableMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
  .size_ctrl.size = 0;
  (this->configBlocks).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->configBlocks).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->configBlocks).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->configBlocks).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->configBlocks).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  ppVar36 = (this->configBlocks).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
            .arrays.elements_;
  if (ppVar36 != (value_type_pointer)0x0) {
    ppVar36 = (value_type_pointer)0x1d;
  }
  (this->configBlocks).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
  .size_ctrl.ml = (size_t)ppVar36;
  (this->configBlocks).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
  .size_ctrl.size = 0;
  (this->configBySyntax).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->configBySyntax).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
  .arrays.groups_size_mask = 1;
  (this->configBySyntax).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->configBySyntax).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->configBySyntax).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  ppVar37 = (this->configBySyntax).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
            .arrays.elements_;
  if (ppVar37 != (value_type_pointer)0x0) {
    ppVar37 = (value_type_pointer)0x1d;
  }
  (this->configBySyntax).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
  .size_ctrl.ml = (size_t)ppVar37;
  (this->configBySyntax).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
  .size_ctrl.size = 0;
  local_f8 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
             &this->libraryNameMap;
  (this->libraryNameMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->libraryNameMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
  .arrays.groups_size_mask = 1;
  (this->libraryNameMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->libraryNameMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->libraryNameMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  ppVar38 = (this->libraryNameMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
            .arrays.elements_;
  if (ppVar38 != (value_type_pointer)0x0) {
    ppVar38 = (value_type_pointer)0x1d;
  }
  (this->libraryNameMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
  .size_ctrl.ml = (size_t)ppVar38;
  (this->libraryNameMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
  .size_ctrl.size = 0;
  (this->instancesWithDefBinds).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*>_>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->instancesWithDefBinds).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*>_>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->instancesWithDefBinds).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*>_>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*>_>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->instancesWithDefBinds).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*>_>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->instancesWithDefBinds).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*>_>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  ppVar39 = (this->instancesWithDefBinds).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*>_>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*>_>_>_>
            .arrays.elements_;
  if (ppVar39 != (value_type_pointer)0x0) {
    ppVar39 = (value_type_pointer)0x1d;
  }
  (this->instancesWithDefBinds).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*>_>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*>_>_>_>
  .size_ctrl.ml = (size_t)ppVar39;
  (this->instancesWithDefBinds).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*>_>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*>_>_>_>
  .size_ctrl.size = 0;
  (this->externDefMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->externDefMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
  .arrays.groups_size_mask = 1;
  (this->externDefMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->externDefMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->externDefMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  ppVar40 = (this->externDefMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
            .arrays.elements_;
  if (ppVar40 != (value_type_pointer)0x0) {
    ppVar40 = (value_type_pointer)0x1d;
  }
  (this->externDefMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
  .size_ctrl.ml = (size_t)ppVar40;
  (this->externDefMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
  .size_ctrl.size = 0;
  (this->netAliasAllocator).alloc = &this->super_BumpAllocator;
  (this->netAliasAllocator).freeList = (FreeNode *)0x0;
  (this->netAliases).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->netAliases).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->netAliases).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->netAliases).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->netAliases).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  ppVar41 = (this->netAliases).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>_>_>
            .arrays.elements_;
  if (ppVar41 != (value_type_pointer)0x0) {
    ppVar41 = (value_type_pointer)0x1d;
  }
  (this->netAliases).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>_>_>
  .size_ctrl.ml = (size_t)ppVar41;
  (this->netAliases).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>_>_>
  .size_ctrl.size = 0;
  local_a0 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
              *)&this->subroutineNameMap;
  (this->subroutineNameMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->subroutineNameMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->subroutineNameMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->subroutineNameMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->subroutineNameMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  if ((this->subroutineNameMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
      .arrays.elements_ == (value_type_pointer)0x0) {
    sVar23 = 0;
  }
  (this->subroutineNameMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  .size_ctrl.ml = sVar23;
  local_b8 = (default_delete<slang::SourceLibrary> *)&this->defaultLibMem;
  (this->defaultLibMem)._M_t.
  super___uniq_ptr_impl<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>._M_t.
  super__Tuple_impl<0UL,_slang::SourceLibrary_*,_std::default_delete<slang::SourceLibrary>_>.
  super__Head_base<0UL,_slang::SourceLibrary_*,_false>._M_head_impl = (SourceLibrary *)0x0;
  *(undefined1 (*) [16])
   &(this->subroutineNameMap).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
    .size_ctrl.size = (undefined1  [16])0x0;
  this->defaultLibPtr = defaultLib;
  this->bitType = (Type *)ast::builtins::Builtins::Instance;
  this->logicType = (Type *)(ast::builtins::Builtins::Instance + 0x58);
  this->intType = (Type *)(ast::builtins::Builtins::Instance + 0x210);
  this->byteType = (Type *)(ast::builtins::Builtins::Instance + 0x2c0);
  this->integerType = (Type *)(ast::builtins::Builtins::Instance + 0x318);
  this->realType = (Type *)(ast::builtins::Builtins::Instance + 0x4d0);
  this->shortRealType = (Type *)(ast::builtins::Builtins::Instance + 0x520);
  this->stringType = (Type *)(ast::builtins::Builtins::Instance + 0x5c0);
  this->voidType = (Type *)(ast::builtins::Builtins::Instance + 0x608);
  this->errorType = (Type *)(ast::builtins::Builtins::Instance + 0x890);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::syntax::SyntaxKind,_void>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
  ::rehash((table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::syntax::SyntaxKind,_void>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
            *)this_00,0x25);
  local_168._M_len._0_4_ = 0x1a7;
  uVar15 = (undefined4)local_168._M_len;
  local_168._M_len._0_4_ = 0x1a7;
  uVar18 = 0x6daa2181541307b6 >>
           ((byte)(local_170->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  local_c0 = (value_type_pointer)
             &(local_170->packageMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
              .size_ctrl.size;
  local_100 = &local_170->stdPkg;
  pgVar6 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_;
  ppVar44 = (local_170->knownTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar2 = pgVar6 + uVar54;
    auVar60[0] = -(pgVar2->m[0].n == 0xb6);
    auVar60[1] = -(pgVar2->m[1].n == 0xb6);
    auVar60[2] = -(pgVar2->m[2].n == 0xb6);
    auVar60[3] = -(pgVar2->m[3].n == 0xb6);
    auVar60[4] = -(pgVar2->m[4].n == 0xb6);
    auVar60[5] = -(pgVar2->m[5].n == 0xb6);
    auVar60[6] = -(pgVar2->m[6].n == 0xb6);
    auVar60[7] = -(pgVar2->m[7].n == 0xb6);
    auVar60[8] = -(pgVar2->m[8].n == 0xb6);
    auVar60[9] = -(pgVar2->m[9].n == 0xb6);
    auVar60[10] = -(pgVar2->m[10].n == 0xb6);
    auVar60[0xb] = -(pgVar2->m[0xb].n == 0xb6);
    auVar60[0xc] = -(pgVar2->m[0xc].n == 0xb6);
    auVar60[0xd] = -(pgVar2->m[0xd].n == 0xb6);
    auVar60[0xe] = -(pgVar2->m[0xe].n == 0xb6);
    auVar60[0xf] = -(pgVar2->m[0xf].n == 0xb6);
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar60 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar60 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar60 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar60 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar60 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar60 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar60 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar60 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar60 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar60 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar60 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar60 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar60 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar60 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar60 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(int *)((long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0x1a7) {
        lVar53 = (long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001eff16;
      }
    }
    if ((pgVar6[uVar54].m[0xf].n & 0x40) == 0) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001eff16:
  if (lVar53 == 0) {
    if ((local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.size <
        (local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,(arrays_type *)this_00,uVar18,0x6daa2181541307b6,&local_171,
                 (SyntaxKind *)&local_168);
      psVar1 = &(local_170->knownTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      local_168._M_len._0_4_ = uVar15;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,0x6daa2181541307b6,&local_171,(SyntaxKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  *(undefined8 *)(lVar53 + 8) = 0x5d3f48;
  pTVar7 = local_170->intType;
  local_168._M_len._0_4_ = 0xff;
  uVar15 = (undefined4)local_168._M_len;
  local_168._M_len._0_4_ = 0xff;
  uVar18 = 0x99423fc5cb319876 >>
           ((byte)(local_170->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar6 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_;
  ppVar44 = (local_170->knownTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar2 = pgVar6 + uVar54;
    auVar75[0] = -(pgVar2->m[0].n == 'v');
    auVar75[1] = -(pgVar2->m[1].n == 'v');
    auVar75[2] = -(pgVar2->m[2].n == 'v');
    auVar75[3] = -(pgVar2->m[3].n == 'v');
    auVar75[4] = -(pgVar2->m[4].n == 'v');
    auVar75[5] = -(pgVar2->m[5].n == 'v');
    auVar75[6] = -(pgVar2->m[6].n == 'v');
    auVar75[7] = -(pgVar2->m[7].n == 'v');
    auVar75[8] = -(pgVar2->m[8].n == 'v');
    auVar75[9] = -(pgVar2->m[9].n == 'v');
    auVar75[10] = -(pgVar2->m[10].n == 'v');
    auVar75[0xb] = -(pgVar2->m[0xb].n == 'v');
    auVar75[0xc] = -(pgVar2->m[0xc].n == 'v');
    auVar75[0xd] = -(pgVar2->m[0xd].n == 'v');
    auVar75[0xe] = -(pgVar2->m[0xe].n == 'v');
    auVar75[0xf] = -(pgVar2->m[0xf].n == 'v');
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar75 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar75 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar75 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar75 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar75 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar75 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar75 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar75 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar75 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar75 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar75 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar75 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar75 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar75 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar75 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(int *)((long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0xff) {
        lVar53 = (long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f004f;
      }
    }
    if ((pgVar6[uVar54].m[0xf].n & 0x40) == 0) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f004f:
  if (lVar53 == 0) {
    if ((local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.size <
        (local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,(arrays_type *)this_00,uVar18,0x99423fc5cb319876,&local_171,
                 (SyntaxKind *)&local_168);
      psVar1 = &(local_170->knownTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      local_168._M_len._0_4_ = uVar15;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,0x99423fc5cb319876,&local_171,(SyntaxKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  *(Type **)(lVar53 + 8) = pTVar7;
  local_168._M_len._0_4_ = 0x11d;
  uVar15 = (undefined4)local_168._M_len;
  local_168._M_len._0_4_ = 0x11d;
  uVar18 = 0x23c28382b5ec23d1 >>
           ((byte)(local_170->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar6 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_;
  ppVar44 = (local_170->knownTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar2 = pgVar6 + uVar54;
    auVar61[0] = -(pgVar2->m[0].n == 0xd1);
    auVar61[1] = -(pgVar2->m[1].n == 0xd1);
    auVar61[2] = -(pgVar2->m[2].n == 0xd1);
    auVar61[3] = -(pgVar2->m[3].n == 0xd1);
    auVar61[4] = -(pgVar2->m[4].n == 0xd1);
    auVar61[5] = -(pgVar2->m[5].n == 0xd1);
    auVar61[6] = -(pgVar2->m[6].n == 0xd1);
    auVar61[7] = -(pgVar2->m[7].n == 0xd1);
    auVar61[8] = -(pgVar2->m[8].n == 0xd1);
    auVar61[9] = -(pgVar2->m[9].n == 0xd1);
    auVar61[10] = -(pgVar2->m[10].n == 0xd1);
    auVar61[0xb] = -(pgVar2->m[0xb].n == 0xd1);
    auVar61[0xc] = -(pgVar2->m[0xc].n == 0xd1);
    auVar61[0xd] = -(pgVar2->m[0xd].n == 0xd1);
    auVar61[0xe] = -(pgVar2->m[0xe].n == 0xd1);
    auVar61[0xf] = -(pgVar2->m[0xf].n == 0xd1);
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar61 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar61 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar61 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar61 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar61 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar61 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar61 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar61 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar61 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar61 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar61 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar61 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar61 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar61 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar61 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(int *)((long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0x11d) {
        lVar53 = (long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f0182;
      }
    }
    if ((pgVar6[uVar54].m[0xf].n & 2) == 0) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f0182:
  if (lVar53 == 0) {
    if ((local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.size <
        (local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,(arrays_type *)this_00,uVar18,0x23c28382b5ec23d1,&local_171,
                 (SyntaxKind *)&local_168);
      psVar1 = &(local_170->knownTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      local_168._M_len._0_4_ = uVar15;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,0x23c28382b5ec23d1,&local_171,(SyntaxKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  *(undefined8 *)(lVar53 + 8) = 0x5d3fa0;
  pTVar7 = local_170->byteType;
  local_168._M_len._0_4_ = 0x39;
  uVar15 = (undefined4)local_168._M_len;
  local_168._M_len._0_4_ = 0x39;
  uVar18 = 0x3a5a1a4d5795a08e >>
           ((byte)(local_170->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar6 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_;
  ppVar44 = (local_170->knownTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar2 = pgVar6 + uVar54;
    auVar76[0] = -(pgVar2->m[0].n == 0x8e);
    auVar76[1] = -(pgVar2->m[1].n == 0x8e);
    auVar76[2] = -(pgVar2->m[2].n == 0x8e);
    auVar76[3] = -(pgVar2->m[3].n == 0x8e);
    auVar76[4] = -(pgVar2->m[4].n == 0x8e);
    auVar76[5] = -(pgVar2->m[5].n == 0x8e);
    auVar76[6] = -(pgVar2->m[6].n == 0x8e);
    auVar76[7] = -(pgVar2->m[7].n == 0x8e);
    auVar76[8] = -(pgVar2->m[8].n == 0x8e);
    auVar76[9] = -(pgVar2->m[9].n == 0x8e);
    auVar76[10] = -(pgVar2->m[10].n == 0x8e);
    auVar76[0xb] = -(pgVar2->m[0xb].n == 0x8e);
    auVar76[0xc] = -(pgVar2->m[0xc].n == 0x8e);
    auVar76[0xd] = -(pgVar2->m[0xd].n == 0x8e);
    auVar76[0xe] = -(pgVar2->m[0xe].n == 0x8e);
    auVar76[0xf] = -(pgVar2->m[0xf].n == 0x8e);
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar76 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar76 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar76 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar76 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar76 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar76 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar76 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar76 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar76 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar76 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar76 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar76 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar76 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar76 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar76 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(int *)((long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0x39) {
        lVar53 = (long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f02b1;
      }
    }
    if ((pgVar6[uVar54].m[0xf].n & 0x40) == 0) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f02b1:
  if (lVar53 == 0) {
    if ((local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.size <
        (local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,(arrays_type *)this_00,uVar18,0x3a5a1a4d5795a08e,&local_171,
                 (SyntaxKind *)&local_168);
      psVar1 = &(local_170->knownTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      local_168._M_len._0_4_ = uVar15;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,0x3a5a1a4d5795a08e,&local_171,(SyntaxKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  *(Type **)(lVar53 + 8) = pTVar7;
  pTVar7 = local_170->bitType;
  local_168._M_len._0_4_ = 0x36;
  uVar15 = (undefined4)local_168._M_len;
  local_168._M_len._0_4_ = 0x36;
  uVar18 = 0x5fb3ad20d9b62c4f >>
           ((byte)(local_170->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar6 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_;
  ppVar44 = (local_170->knownTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar2 = pgVar6 + uVar54;
    auVar77[0] = -(pgVar2->m[0].n == 'O');
    auVar77[1] = -(pgVar2->m[1].n == 'O');
    auVar77[2] = -(pgVar2->m[2].n == 'O');
    auVar77[3] = -(pgVar2->m[3].n == 'O');
    auVar77[4] = -(pgVar2->m[4].n == 'O');
    auVar77[5] = -(pgVar2->m[5].n == 'O');
    auVar77[6] = -(pgVar2->m[6].n == 'O');
    auVar77[7] = -(pgVar2->m[7].n == 'O');
    auVar77[8] = -(pgVar2->m[8].n == 'O');
    auVar77[9] = -(pgVar2->m[9].n == 'O');
    auVar77[10] = -(pgVar2->m[10].n == 'O');
    auVar77[0xb] = -(pgVar2->m[0xb].n == 'O');
    auVar77[0xc] = -(pgVar2->m[0xc].n == 'O');
    auVar77[0xd] = -(pgVar2->m[0xd].n == 'O');
    auVar77[0xe] = -(pgVar2->m[0xe].n == 'O');
    auVar77[0xf] = -(pgVar2->m[0xf].n == 'O');
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar77 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar77 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar77 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar77 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar77 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar77 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar77 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar77 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar77 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar77 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar77 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar77 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar77 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar77 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar77 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(int *)((long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0x36) {
        lVar53 = (long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f03d9;
      }
    }
    if (-1 < (char)pgVar6[uVar54].m[0xf].n) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f03d9:
  if (lVar53 == 0) {
    if ((local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.size <
        (local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,(arrays_type *)this_00,uVar18,0x5fb3ad20d9b62c4f,&local_171,
                 (SyntaxKind *)&local_168);
      psVar1 = &(local_170->knownTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      local_168._M_len._0_4_ = uVar15;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,0x5fb3ad20d9b62c4f,&local_171,(SyntaxKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  *(Type **)(lVar53 + 8) = pTVar7;
  pTVar7 = local_170->logicType;
  local_168._M_len._0_4_ = 0x114;
  uVar15 = (undefined4)local_168._M_len;
  local_168._M_len._0_4_ = 0x114;
  uVar18 = 0x93cf3bfd3c4dc60e >>
           ((byte)(local_170->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar6 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_;
  ppVar44 = (local_170->knownTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar2 = pgVar6 + uVar54;
    auVar62[0] = -(pgVar2->m[0].n == '\x0e');
    auVar62[1] = -(pgVar2->m[1].n == '\x0e');
    auVar62[2] = -(pgVar2->m[2].n == '\x0e');
    auVar62[3] = -(pgVar2->m[3].n == '\x0e');
    auVar62[4] = -(pgVar2->m[4].n == '\x0e');
    auVar62[5] = -(pgVar2->m[5].n == '\x0e');
    auVar62[6] = -(pgVar2->m[6].n == '\x0e');
    auVar62[7] = -(pgVar2->m[7].n == '\x0e');
    auVar62[8] = -(pgVar2->m[8].n == '\x0e');
    auVar62[9] = -(pgVar2->m[9].n == '\x0e');
    auVar62[10] = -(pgVar2->m[10].n == '\x0e');
    auVar62[0xb] = -(pgVar2->m[0xb].n == '\x0e');
    auVar62[0xc] = -(pgVar2->m[0xc].n == '\x0e');
    auVar62[0xd] = -(pgVar2->m[0xd].n == '\x0e');
    auVar62[0xe] = -(pgVar2->m[0xe].n == '\x0e');
    auVar62[0xf] = -(pgVar2->m[0xf].n == '\x0e');
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar62 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar62 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar62 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar62 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar62 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar62 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar62 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar62 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar62 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar62 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar62 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar62 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar62 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar62 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar62 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(int *)((long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0x114) {
        lVar53 = (long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f0513;
      }
    }
    if ((pgVar6[uVar54].m[0xf].n & 0x40) == 0) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f0513:
  if (lVar53 == 0) {
    if ((local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.size <
        (local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,(arrays_type *)this_00,uVar18,0x93cf3bfd3c4dc60e,&local_171,
                 (SyntaxKind *)&local_168);
      psVar1 = &(local_170->knownTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      local_168._M_len._0_4_ = uVar15;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,0x93cf3bfd3c4dc60e,&local_171,(SyntaxKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  *(Type **)(lVar53 + 8) = pTVar7;
  local_168._M_len._0_4_ = 400;
  uVar15 = (undefined4)local_168._M_len;
  local_168._M_len._0_4_ = 400;
  uVar18 = 0x36ae31d6e461e027 >>
           ((byte)(local_170->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar6 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_;
  ppVar44 = (local_170->knownTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar2 = pgVar6 + uVar54;
    auVar78[0] = -(pgVar2->m[0].n == '\'');
    auVar78[1] = -(pgVar2->m[1].n == '\'');
    auVar78[2] = -(pgVar2->m[2].n == '\'');
    auVar78[3] = -(pgVar2->m[3].n == '\'');
    auVar78[4] = -(pgVar2->m[4].n == '\'');
    auVar78[5] = -(pgVar2->m[5].n == '\'');
    auVar78[6] = -(pgVar2->m[6].n == '\'');
    auVar78[7] = -(pgVar2->m[7].n == '\'');
    auVar78[8] = -(pgVar2->m[8].n == '\'');
    auVar78[9] = -(pgVar2->m[9].n == '\'');
    auVar78[10] = -(pgVar2->m[10].n == '\'');
    auVar78[0xb] = -(pgVar2->m[0xb].n == '\'');
    auVar78[0xc] = -(pgVar2->m[0xc].n == '\'');
    auVar78[0xd] = -(pgVar2->m[0xd].n == '\'');
    auVar78[0xe] = -(pgVar2->m[0xe].n == '\'');
    auVar78[0xf] = -(pgVar2->m[0xf].n == '\'');
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar78 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar78 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar78 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar78 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar78 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar78 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar78 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar78 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar78 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar78 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar78 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar78 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar78 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar78 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar78 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(int *)((long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 400) {
        lVar53 = (long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f063e;
      }
    }
    if (-1 < (char)pgVar6[uVar54].m[0xf].n) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f063e:
  if (lVar53 == 0) {
    if ((local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.size <
        (local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,(arrays_type *)this_00,uVar18,0x36ae31d6e461e027,&local_171,
                 (SyntaxKind *)&local_168);
      psVar1 = &(local_170->knownTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      local_168._M_len._0_4_ = uVar15;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,0x36ae31d6e461e027,&local_171,(SyntaxKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  *(undefined8 *)(lVar53 + 8) = 0x5d3c88;
  pTVar7 = local_170->integerType;
  local_168._M_len._0_4_ = 0x101;
  uVar15 = (undefined4)local_168._M_len;
  local_168._M_len._0_4_ = 0x101;
  uVar18 = 0xd5b13338c9c6918b >>
           ((byte)(local_170->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar6 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_;
  ppVar44 = (local_170->knownTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar2 = pgVar6 + uVar54;
    auVar79[0] = -(pgVar2->m[0].n == 0x8b);
    auVar79[1] = -(pgVar2->m[1].n == 0x8b);
    auVar79[2] = -(pgVar2->m[2].n == 0x8b);
    auVar79[3] = -(pgVar2->m[3].n == 0x8b);
    auVar79[4] = -(pgVar2->m[4].n == 0x8b);
    auVar79[5] = -(pgVar2->m[5].n == 0x8b);
    auVar79[6] = -(pgVar2->m[6].n == 0x8b);
    auVar79[7] = -(pgVar2->m[7].n == 0x8b);
    auVar79[8] = -(pgVar2->m[8].n == 0x8b);
    auVar79[9] = -(pgVar2->m[9].n == 0x8b);
    auVar79[10] = -(pgVar2->m[10].n == 0x8b);
    auVar79[0xb] = -(pgVar2->m[0xb].n == 0x8b);
    auVar79[0xc] = -(pgVar2->m[0xc].n == 0x8b);
    auVar79[0xd] = -(pgVar2->m[0xd].n == 0x8b);
    auVar79[0xe] = -(pgVar2->m[0xe].n == 0x8b);
    auVar79[0xf] = -(pgVar2->m[0xf].n == 0x8b);
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar79 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar79 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar79 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar79 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar79 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar79 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar79 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar79 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar79 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar79 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar79 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar79 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar79 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar79 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar79 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(int *)((long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0x101) {
        lVar53 = (long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f0777;
      }
    }
    if ((pgVar6[uVar54].m[0xf].n & 8) == 0) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f0777:
  if (lVar53 == 0) {
    if ((local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.size <
        (local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,(arrays_type *)this_00,uVar18,0xd5b13338c9c6918b,&local_171,
                 (SyntaxKind *)&local_168);
      psVar1 = &(local_170->knownTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      local_168._M_len._0_4_ = uVar15;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,0xd5b13338c9c6918b,&local_171,(SyntaxKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  *(Type **)(lVar53 + 8) = pTVar7;
  local_168._M_len._0_4_ = 0x1d0;
  uVar15 = (undefined4)local_168._M_len;
  local_168._M_len._0_4_ = 0x1d0;
  uVar18 = 0xc48ca036b700e70e >>
           ((byte)(local_170->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar6 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_;
  ppVar44 = (local_170->knownTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar2 = pgVar6 + uVar54;
    auVar63[0] = -(pgVar2->m[0].n == '\x0e');
    auVar63[1] = -(pgVar2->m[1].n == '\x0e');
    auVar63[2] = -(pgVar2->m[2].n == '\x0e');
    auVar63[3] = -(pgVar2->m[3].n == '\x0e');
    auVar63[4] = -(pgVar2->m[4].n == '\x0e');
    auVar63[5] = -(pgVar2->m[5].n == '\x0e');
    auVar63[6] = -(pgVar2->m[6].n == '\x0e');
    auVar63[7] = -(pgVar2->m[7].n == '\x0e');
    auVar63[8] = -(pgVar2->m[8].n == '\x0e');
    auVar63[9] = -(pgVar2->m[9].n == '\x0e');
    auVar63[10] = -(pgVar2->m[10].n == '\x0e');
    auVar63[0xb] = -(pgVar2->m[0xb].n == '\x0e');
    auVar63[0xc] = -(pgVar2->m[0xc].n == '\x0e');
    auVar63[0xd] = -(pgVar2->m[0xd].n == '\x0e');
    auVar63[0xe] = -(pgVar2->m[0xe].n == '\x0e');
    auVar63[0xf] = -(pgVar2->m[0xf].n == '\x0e');
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar63 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar63 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar63 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar63 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar63 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar63 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar63 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar63 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar63 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar63 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar63 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar63 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar63 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar63 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar63 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(int *)((long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0x1d0) {
        lVar53 = (long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f089e;
      }
    }
    if ((pgVar6[uVar54].m[0xf].n & 0x40) == 0) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f089e:
  if (lVar53 == 0) {
    if ((local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.size <
        (local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,(arrays_type *)this_00,uVar18,0xc48ca036b700e70e,&local_171,
                 (SyntaxKind *)&local_168);
      psVar1 = &(local_170->knownTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      local_168._M_len._0_4_ = uVar15;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,0xc48ca036b700e70e,&local_171,(SyntaxKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  *(undefined8 *)(lVar53 + 8) = 0x5d4050;
  pTVar7 = local_170->realType;
  local_168._M_len._0_4_ = 399;
  uVar15 = (undefined4)local_168._M_len;
  local_168._M_len._0_4_ = 399;
  uVar18 = 0x9876b81d6517644d >>
           ((byte)(local_170->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar6 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_;
  ppVar44 = (local_170->knownTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar2 = pgVar6 + uVar54;
    auVar80[0] = -(pgVar2->m[0].n == 'M');
    auVar80[1] = -(pgVar2->m[1].n == 'M');
    auVar80[2] = -(pgVar2->m[2].n == 'M');
    auVar80[3] = -(pgVar2->m[3].n == 'M');
    auVar80[4] = -(pgVar2->m[4].n == 'M');
    auVar80[5] = -(pgVar2->m[5].n == 'M');
    auVar80[6] = -(pgVar2->m[6].n == 'M');
    auVar80[7] = -(pgVar2->m[7].n == 'M');
    auVar80[8] = -(pgVar2->m[8].n == 'M');
    auVar80[9] = -(pgVar2->m[9].n == 'M');
    auVar80[10] = -(pgVar2->m[10].n == 'M');
    auVar80[0xb] = -(pgVar2->m[0xb].n == 'M');
    auVar80[0xc] = -(pgVar2->m[0xc].n == 'M');
    auVar80[0xd] = -(pgVar2->m[0xd].n == 'M');
    auVar80[0xe] = -(pgVar2->m[0xe].n == 'M');
    auVar80[0xf] = -(pgVar2->m[0xf].n == 'M');
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar80 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar80 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar80 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar80 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar80 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar80 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar80 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar80 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar80 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar80 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar80 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar80 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar80 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar80 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar80 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(int *)((long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 399) {
        lVar53 = (long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f09d7;
      }
    }
    if ((pgVar6[uVar54].m[0xf].n & 0x20) == 0) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f09d7:
  if (lVar53 == 0) {
    if ((local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.size <
        (local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,(arrays_type *)this_00,uVar18,0x9876b81d6517644d,&local_171,
                 (SyntaxKind *)&local_168);
      psVar1 = &(local_170->knownTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      local_168._M_len._0_4_ = uVar15;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,0x9876b81d6517644d,&local_171,(SyntaxKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  *(Type **)(lVar53 + 8) = pTVar7;
  local_168._M_len._0_4_ = 0x18e;
  uVar15 = (undefined4)local_168._M_len;
  local_168._M_len._0_4_ = 0x18e;
  uVar18 = 0xfa3f3e63e5cce853 >>
           ((byte)(local_170->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar6 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_;
  ppVar44 = (local_170->knownTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar2 = pgVar6 + uVar54;
    auVar81[0] = -(pgVar2->m[0].n == 'S');
    auVar81[1] = -(pgVar2->m[1].n == 'S');
    auVar81[2] = -(pgVar2->m[2].n == 'S');
    auVar81[3] = -(pgVar2->m[3].n == 'S');
    auVar81[4] = -(pgVar2->m[4].n == 'S');
    auVar81[5] = -(pgVar2->m[5].n == 'S');
    auVar81[6] = -(pgVar2->m[6].n == 'S');
    auVar81[7] = -(pgVar2->m[7].n == 'S');
    auVar81[8] = -(pgVar2->m[8].n == 'S');
    auVar81[9] = -(pgVar2->m[9].n == 'S');
    auVar81[10] = -(pgVar2->m[10].n == 'S');
    auVar81[0xb] = -(pgVar2->m[0xb].n == 'S');
    auVar81[0xc] = -(pgVar2->m[0xc].n == 'S');
    auVar81[0xd] = -(pgVar2->m[0xd].n == 'S');
    auVar81[0xe] = -(pgVar2->m[0xe].n == 'S');
    auVar81[0xf] = -(pgVar2->m[0xf].n == 'S');
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar81 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar81 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar81 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar81 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar81 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar81 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar81 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar81 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar81 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar81 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar81 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar81 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar81 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar81 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar81 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(int *)((long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0x18e) {
        lVar53 = (long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f0b02;
      }
    }
    if ((pgVar6[uVar54].m[0xf].n & 8) == 0) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f0b02:
  if (lVar53 == 0) {
    if ((local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.size <
        (local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,(arrays_type *)this_00,uVar18,0xfa3f3e63e5cce853,&local_171,
                 (SyntaxKind *)&local_168);
      psVar1 = &(local_170->knownTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      local_168._M_len._0_4_ = uVar15;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,0xfa3f3e63e5cce853,&local_171,(SyntaxKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  *(undefined8 *)(lVar53 + 8) = 0x5d4148;
  pTVar7 = local_170->shortRealType;
  local_168._M_len._0_4_ = 0x1a8;
  uVar15 = (undefined4)local_168._M_len;
  local_168._M_len._0_4_ = 0x1a8;
  uVar18 = 0xbe19b3ad35d83ce >>
           ((byte)(local_170->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar6 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_;
  ppVar44 = (local_170->knownTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar2 = pgVar6 + uVar54;
    auVar82[0] = -(pgVar2->m[0].n == 0xce);
    auVar82[1] = -(pgVar2->m[1].n == 0xce);
    auVar82[2] = -(pgVar2->m[2].n == 0xce);
    auVar82[3] = -(pgVar2->m[3].n == 0xce);
    auVar82[4] = -(pgVar2->m[4].n == 0xce);
    auVar82[5] = -(pgVar2->m[5].n == 0xce);
    auVar82[6] = -(pgVar2->m[6].n == 0xce);
    auVar82[7] = -(pgVar2->m[7].n == 0xce);
    auVar82[8] = -(pgVar2->m[8].n == 0xce);
    auVar82[9] = -(pgVar2->m[9].n == 0xce);
    auVar82[10] = -(pgVar2->m[10].n == 0xce);
    auVar82[0xb] = -(pgVar2->m[0xb].n == 0xce);
    auVar82[0xc] = -(pgVar2->m[0xc].n == 0xce);
    auVar82[0xd] = -(pgVar2->m[0xd].n == 0xce);
    auVar82[0xe] = -(pgVar2->m[0xe].n == 0xce);
    auVar82[0xf] = -(pgVar2->m[0xf].n == 0xce);
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar82 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar82 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar82 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar82 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar82 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar82 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar82 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar82 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar82 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar82 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar82 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar82 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar82 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar82 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar82 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(int *)((long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0x1a8) {
        lVar53 = (long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f0c3b;
      }
    }
    if ((pgVar6[uVar54].m[0xf].n & 0x40) == 0) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f0c3b:
  if (lVar53 == 0) {
    if ((local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.size <
        (local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,(arrays_type *)this_00,uVar18,0xbe19b3ad35d83ce,&local_171,
                 (SyntaxKind *)&local_168);
      psVar1 = &(local_170->knownTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      local_168._M_len._0_4_ = uVar15;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,0xbe19b3ad35d83ce,&local_171,(SyntaxKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  *(Type **)(lVar53 + 8) = pTVar7;
  pTVar7 = local_170->stringType;
  local_168._M_len._0_4_ = 0x1bd;
  uVar15 = (undefined4)local_168._M_len;
  local_168._M_len._0_4_ = 0x1bd;
  uVar18 = 0x66e97724479b192 >>
           ((byte)(local_170->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar6 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_;
  ppVar44 = (local_170->knownTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar2 = pgVar6 + uVar54;
    auVar64[0] = -(pgVar2->m[0].n == 0x92);
    auVar64[1] = -(pgVar2->m[1].n == 0x92);
    auVar64[2] = -(pgVar2->m[2].n == 0x92);
    auVar64[3] = -(pgVar2->m[3].n == 0x92);
    auVar64[4] = -(pgVar2->m[4].n == 0x92);
    auVar64[5] = -(pgVar2->m[5].n == 0x92);
    auVar64[6] = -(pgVar2->m[6].n == 0x92);
    auVar64[7] = -(pgVar2->m[7].n == 0x92);
    auVar64[8] = -(pgVar2->m[8].n == 0x92);
    auVar64[9] = -(pgVar2->m[9].n == 0x92);
    auVar64[10] = -(pgVar2->m[10].n == 0x92);
    auVar64[0xb] = -(pgVar2->m[0xb].n == 0x92);
    auVar64[0xc] = -(pgVar2->m[0xc].n == 0x92);
    auVar64[0xd] = -(pgVar2->m[0xd].n == 0x92);
    auVar64[0xe] = -(pgVar2->m[0xe].n == 0x92);
    auVar64[0xf] = -(pgVar2->m[0xf].n == 0x92);
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar64 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar64 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar64 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar64 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar64 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar64 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar64 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar64 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar64 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar64 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar64 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar64 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar64 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar64 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar64 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(int *)((long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0x1bd) {
        lVar53 = (long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f0d75;
      }
    }
    if ((pgVar6[uVar54].m[0xf].n & 4) == 0) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f0d75:
  if (lVar53 == 0) {
    if ((local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.size <
        (local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,(arrays_type *)this_00,uVar18,0x66e97724479b192,&local_171,
                 (SyntaxKind *)&local_168);
      psVar1 = &(local_170->knownTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      local_168._M_len._0_4_ = uVar15;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,0x66e97724479b192,&local_171,(SyntaxKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  *(Type **)(lVar53 + 8) = pTVar7;
  local_168._M_len._0_4_ = 0x3a;
  uVar15 = (undefined4)local_168._M_len;
  local_168._M_len._0_4_ = 0x3a;
  uVar18 = 0xd8919406d6e01ce1 >>
           ((byte)(local_170->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar6 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_;
  ppVar44 = (local_170->knownTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar2 = pgVar6 + uVar54;
    auVar83[0] = -(pgVar2->m[0].n == 0xe1);
    auVar83[1] = -(pgVar2->m[1].n == 0xe1);
    auVar83[2] = -(pgVar2->m[2].n == 0xe1);
    auVar83[3] = -(pgVar2->m[3].n == 0xe1);
    auVar83[4] = -(pgVar2->m[4].n == 0xe1);
    auVar83[5] = -(pgVar2->m[5].n == 0xe1);
    auVar83[6] = -(pgVar2->m[6].n == 0xe1);
    auVar83[7] = -(pgVar2->m[7].n == 0xe1);
    auVar83[8] = -(pgVar2->m[8].n == 0xe1);
    auVar83[9] = -(pgVar2->m[9].n == 0xe1);
    auVar83[10] = -(pgVar2->m[10].n == 0xe1);
    auVar83[0xb] = -(pgVar2->m[0xb].n == 0xe1);
    auVar83[0xc] = -(pgVar2->m[0xc].n == 0xe1);
    auVar83[0xd] = -(pgVar2->m[0xd].n == 0xe1);
    auVar83[0xe] = -(pgVar2->m[0xe].n == 0xe1);
    auVar83[0xf] = -(pgVar2->m[0xf].n == 0xe1);
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar83 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar83 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar83 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar83 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar83 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar83 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar83 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar83 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar83 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar83 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar83 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar83 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar83 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar83 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar83 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(int *)((long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0x3a) {
        lVar53 = (long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f0e96;
      }
    }
    if ((pgVar6[uVar54].m[0xf].n & 2) == 0) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f0e96:
  if (lVar53 == 0) {
    if ((local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.size <
        (local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,(arrays_type *)this_00,uVar18,0xd8919406d6e01ce1,&local_171,
                 (SyntaxKind *)&local_168);
      psVar1 = &(local_170->knownTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      local_168._M_len._0_4_ = uVar15;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,0xd8919406d6e01ce1,&local_171,(SyntaxKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  *(undefined8 *)(lVar53 + 8) = 0x5d4228;
  local_168._M_len._0_4_ = 0x14d;
  uVar15 = (undefined4)local_168._M_len;
  local_168._M_len._0_4_ = 0x14d;
  uVar18 = 0xce29564a93e3679c >>
           ((byte)(local_170->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar6 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_;
  ppVar44 = (local_170->knownTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar2 = pgVar6 + uVar54;
    auVar84[0] = -(pgVar2->m[0].n == 0x9c);
    auVar84[1] = -(pgVar2->m[1].n == 0x9c);
    auVar84[2] = -(pgVar2->m[2].n == 0x9c);
    auVar84[3] = -(pgVar2->m[3].n == 0x9c);
    auVar84[4] = -(pgVar2->m[4].n == 0x9c);
    auVar84[5] = -(pgVar2->m[5].n == 0x9c);
    auVar84[6] = -(pgVar2->m[6].n == 0x9c);
    auVar84[7] = -(pgVar2->m[7].n == 0x9c);
    auVar84[8] = -(pgVar2->m[8].n == 0x9c);
    auVar84[9] = -(pgVar2->m[9].n == 0x9c);
    auVar84[10] = -(pgVar2->m[10].n == 0x9c);
    auVar84[0xb] = -(pgVar2->m[0xb].n == 0x9c);
    auVar84[0xc] = -(pgVar2->m[0xc].n == 0x9c);
    auVar84[0xd] = -(pgVar2->m[0xd].n == 0x9c);
    auVar84[0xe] = -(pgVar2->m[0xe].n == 0x9c);
    auVar84[0xf] = -(pgVar2->m[0xf].n == 0x9c);
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar84 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar84 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar84 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar84 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar84 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar84 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar84 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar84 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar84 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar84 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar84 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar84 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar84 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar84 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar84 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(int *)((long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0x14d) {
        lVar53 = (long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f0fc8;
      }
    }
    if ((pgVar6[uVar54].m[0xf].n & 0x10) == 0) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f0fc8:
  if (lVar53 == 0) {
    if ((local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.size <
        (local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,(arrays_type *)this_00,uVar18,0xce29564a93e3679c,&local_171,
                 (SyntaxKind *)&local_168);
      psVar1 = &(local_170->knownTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      local_168._M_len._0_4_ = uVar15;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,0xce29564a93e3679c,&local_171,(SyntaxKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  *(undefined8 *)(lVar53 + 8) = 0x5d4270;
  pTVar7 = local_170->voidType;
  local_168._M_len._0_4_ = 0x207;
  uVar15 = (undefined4)local_168._M_len;
  local_168._M_len._0_4_ = 0x207;
  uVar18 = 0xc277c71110018fd3 >>
           ((byte)(local_170->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar6 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_;
  ppVar44 = (local_170->knownTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar2 = pgVar6 + uVar54;
    auVar85[0] = -(pgVar2->m[0].n == 0xd3);
    auVar85[1] = -(pgVar2->m[1].n == 0xd3);
    auVar85[2] = -(pgVar2->m[2].n == 0xd3);
    auVar85[3] = -(pgVar2->m[3].n == 0xd3);
    auVar85[4] = -(pgVar2->m[4].n == 0xd3);
    auVar85[5] = -(pgVar2->m[5].n == 0xd3);
    auVar85[6] = -(pgVar2->m[6].n == 0xd3);
    auVar85[7] = -(pgVar2->m[7].n == 0xd3);
    auVar85[8] = -(pgVar2->m[8].n == 0xd3);
    auVar85[9] = -(pgVar2->m[9].n == 0xd3);
    auVar85[10] = -(pgVar2->m[10].n == 0xd3);
    auVar85[0xb] = -(pgVar2->m[0xb].n == 0xd3);
    auVar85[0xc] = -(pgVar2->m[0xc].n == 0xd3);
    auVar85[0xd] = -(pgVar2->m[0xd].n == 0xd3);
    auVar85[0xe] = -(pgVar2->m[0xe].n == 0xd3);
    auVar85[0xf] = -(pgVar2->m[0xf].n == 0xd3);
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar85 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar85 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar85 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar85 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar85 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar85 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar85 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar85 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar85 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar85 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar85 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar85 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar85 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar85 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar85 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(int *)((long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0x207) {
        lVar53 = (long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f1101;
      }
    }
    if ((pgVar6[uVar54].m[0xf].n & 8) == 0) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f1101:
  if (lVar53 == 0) {
    if ((local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.size <
        (local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,(arrays_type *)this_00,uVar18,0xc277c71110018fd3,&local_171,
                 (SyntaxKind *)&local_168);
      psVar1 = &(local_170->knownTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      local_168._M_len._0_4_ = uVar15;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,0xc277c71110018fd3,&local_171,(SyntaxKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  *(Type **)(lVar53 + 8) = pTVar7;
  local_168._M_len._0_4_ = 0xc0;
  uVar15 = (undefined4)local_168._M_len;
  local_168._M_len._0_4_ = 0xc0;
  uVar18 = 0xa99b4b1f77dd0fb6 >>
           ((byte)(local_170->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar6 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_;
  ppVar44 = (local_170->knownTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar2 = pgVar6 + uVar54;
    auVar65[0] = -(pgVar2->m[0].n == 0xb6);
    auVar65[1] = -(pgVar2->m[1].n == 0xb6);
    auVar65[2] = -(pgVar2->m[2].n == 0xb6);
    auVar65[3] = -(pgVar2->m[3].n == 0xb6);
    auVar65[4] = -(pgVar2->m[4].n == 0xb6);
    auVar65[5] = -(pgVar2->m[5].n == 0xb6);
    auVar65[6] = -(pgVar2->m[6].n == 0xb6);
    auVar65[7] = -(pgVar2->m[7].n == 0xb6);
    auVar65[8] = -(pgVar2->m[8].n == 0xb6);
    auVar65[9] = -(pgVar2->m[9].n == 0xb6);
    auVar65[10] = -(pgVar2->m[10].n == 0xb6);
    auVar65[0xb] = -(pgVar2->m[0xb].n == 0xb6);
    auVar65[0xc] = -(pgVar2->m[0xc].n == 0xb6);
    auVar65[0xd] = -(pgVar2->m[0xd].n == 0xb6);
    auVar65[0xe] = -(pgVar2->m[0xe].n == 0xb6);
    auVar65[0xf] = -(pgVar2->m[0xf].n == 0xb6);
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar65 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar65 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar65 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar65 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar65 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar65 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar65 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar65 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar65 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar65 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar65 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar65 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar65 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar65 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar65 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(int *)((long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0xc0) {
        lVar53 = (long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f1228;
      }
    }
    if ((pgVar6[uVar54].m[0xf].n & 0x40) == 0) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f1228:
  if (lVar53 == 0) {
    if ((local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.size <
        (local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,(arrays_type *)this_00,uVar18,0xa99b4b1f77dd0fb6,&local_171,
                 (SyntaxKind *)&local_168);
      psVar1 = &(local_170->knownTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      local_168._M_len._0_4_ = uVar15;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,0xa99b4b1f77dd0fb6,&local_171,(SyntaxKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  *(undefined8 *)(lVar53 + 8) = 0x5d42b8;
  local_168._M_len._0_4_ = 0x20e;
  uVar15 = (undefined4)local_168._M_len;
  local_168._M_len._0_4_ = 0x20e;
  uVar18 = 0x15fc1b238b0af263 >>
           ((byte)(local_170->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar6 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_;
  ppVar44 = (local_170->knownTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar2 = pgVar6 + uVar54;
    auVar86[0] = -(pgVar2->m[0].n == 'c');
    auVar86[1] = -(pgVar2->m[1].n == 'c');
    auVar86[2] = -(pgVar2->m[2].n == 'c');
    auVar86[3] = -(pgVar2->m[3].n == 'c');
    auVar86[4] = -(pgVar2->m[4].n == 'c');
    auVar86[5] = -(pgVar2->m[5].n == 'c');
    auVar86[6] = -(pgVar2->m[6].n == 'c');
    auVar86[7] = -(pgVar2->m[7].n == 'c');
    auVar86[8] = -(pgVar2->m[8].n == 'c');
    auVar86[9] = -(pgVar2->m[9].n == 'c');
    auVar86[10] = -(pgVar2->m[10].n == 'c');
    auVar86[0xb] = -(pgVar2->m[0xb].n == 'c');
    auVar86[0xc] = -(pgVar2->m[0xc].n == 'c');
    auVar86[0xd] = -(pgVar2->m[0xd].n == 'c');
    auVar86[0xe] = -(pgVar2->m[0xe].n == 'c');
    auVar86[0xf] = -(pgVar2->m[0xf].n == 'c');
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar86 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar86 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar86 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar86 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar86 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar86 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar86 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar86 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar86 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar86 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar86 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar86 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar86 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar86 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar86 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(int *)((long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0x20e) {
        lVar53 = (long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f135a;
      }
    }
    if ((pgVar6[uVar54].m[0xf].n & 8) == 0) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f135a:
  if (lVar53 == 0) {
    if ((local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.size <
        (local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,(arrays_type *)this_00,uVar18,0x15fc1b238b0af263,&local_171,
                 (SyntaxKind *)&local_168);
      psVar1 = &(local_170->knownTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      local_168._M_len._0_4_ = uVar15;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,0x15fc1b238b0af263,&local_171,(SyntaxKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  *(undefined8 *)(lVar53 + 8) = 0x5d4300;
  local_168._M_len._0_4_ = 0x1dc;
  uVar15 = (undefined4)local_168._M_len;
  local_168._M_len._0_4_ = 0x1dc;
  uVar18 = 0x2f2654e8ae7eb62a >>
           ((byte)(local_170->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar6 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_;
  ppVar44 = (local_170->knownTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar2 = pgVar6 + uVar54;
    auVar87[0] = -(pgVar2->m[0].n == '*');
    auVar87[1] = -(pgVar2->m[1].n == '*');
    auVar87[2] = -(pgVar2->m[2].n == '*');
    auVar87[3] = -(pgVar2->m[3].n == '*');
    auVar87[4] = -(pgVar2->m[4].n == '*');
    auVar87[5] = -(pgVar2->m[5].n == '*');
    auVar87[6] = -(pgVar2->m[6].n == '*');
    auVar87[7] = -(pgVar2->m[7].n == '*');
    auVar87[8] = -(pgVar2->m[8].n == '*');
    auVar87[9] = -(pgVar2->m[9].n == '*');
    auVar87[10] = -(pgVar2->m[10].n == '*');
    auVar87[0xb] = -(pgVar2->m[0xb].n == '*');
    auVar87[0xc] = -(pgVar2->m[0xc].n == '*');
    auVar87[0xd] = -(pgVar2->m[0xd].n == '*');
    auVar87[0xe] = -(pgVar2->m[0xe].n == '*');
    auVar87[0xf] = -(pgVar2->m[0xf].n == '*');
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar87 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar87 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar87 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar87 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar87 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar87 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar87 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar87 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar87 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar87 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar87 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar87 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar87 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar87 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar87 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(int *)((long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0x1dc) {
        lVar53 = (long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f148c;
      }
    }
    if ((pgVar6[uVar54].m[0xf].n & 4) == 0) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f148c:
  if (lVar53 == 0) {
    if ((local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.size <
        (local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,(arrays_type *)this_00,uVar18,0x2f2654e8ae7eb62a,&local_171,
                 (SyntaxKind *)&local_168);
      psVar1 = &(local_170->knownTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      local_168._M_len._0_4_ = uVar15;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,0x2f2654e8ae7eb62a,&local_171,(SyntaxKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  *(undefined8 *)(lVar53 + 8) = 0x5d4348;
  local_168._M_len._0_4_ = 0x1ff;
  uVar15 = (undefined4)local_168._M_len;
  local_168._M_len._0_4_ = 0x1ff;
  uVar18 = 0xd0bbf94515adacd0 >>
           ((byte)(local_170->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar6 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_;
  ppVar44 = (local_170->knownTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar2 = pgVar6 + uVar54;
    auVar88[0] = -(pgVar2->m[0].n == 0xd0);
    auVar88[1] = -(pgVar2->m[1].n == 0xd0);
    auVar88[2] = -(pgVar2->m[2].n == 0xd0);
    auVar88[3] = -(pgVar2->m[3].n == 0xd0);
    auVar88[4] = -(pgVar2->m[4].n == 0xd0);
    auVar88[5] = -(pgVar2->m[5].n == 0xd0);
    auVar88[6] = -(pgVar2->m[6].n == 0xd0);
    auVar88[7] = -(pgVar2->m[7].n == 0xd0);
    auVar88[8] = -(pgVar2->m[8].n == 0xd0);
    auVar88[9] = -(pgVar2->m[9].n == 0xd0);
    auVar88[10] = -(pgVar2->m[10].n == 0xd0);
    auVar88[0xb] = -(pgVar2->m[0xb].n == 0xd0);
    auVar88[0xc] = -(pgVar2->m[0xc].n == 0xd0);
    auVar88[0xd] = -(pgVar2->m[0xd].n == 0xd0);
    auVar88[0xe] = -(pgVar2->m[0xe].n == 0xd0);
    auVar88[0xf] = -(pgVar2->m[0xf].n == 0xd0);
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar88 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar88 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar88 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar88 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar88 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar88 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar88 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar88 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar88 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar88 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar88 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar88 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar88 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar88 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar88 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(int *)((long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0x1ff) {
        lVar53 = (long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f15be;
      }
    }
    if ((pgVar6[uVar54].m[0xf].n & 1) == 0) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f15be:
  if (lVar53 == 0) {
    if ((local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.size <
        (local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,(arrays_type *)this_00,uVar18,0xd0bbf94515adacd0,&local_171,
                 (SyntaxKind *)&local_168);
      psVar1 = &(local_170->knownTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      local_168._M_len._0_4_ = uVar15;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,0xd0bbf94515adacd0,&local_171,(SyntaxKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  *(undefined8 *)(lVar53 + 8) = 0x5d4390;
  local_168._M_len._0_4_ = 0x1a5;
  uVar15 = (undefined4)local_168._M_len;
  local_168._M_len._0_4_ = 0x1a5;
  uVar18 = 0x313b2e0e557e0f8d >>
           ((byte)(local_170->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar6 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_;
  ppVar44 = (local_170->knownTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar2 = pgVar6 + uVar54;
    auVar89[0] = -(pgVar2->m[0].n == 0x8d);
    auVar89[1] = -(pgVar2->m[1].n == 0x8d);
    auVar89[2] = -(pgVar2->m[2].n == 0x8d);
    auVar89[3] = -(pgVar2->m[3].n == 0x8d);
    auVar89[4] = -(pgVar2->m[4].n == 0x8d);
    auVar89[5] = -(pgVar2->m[5].n == 0x8d);
    auVar89[6] = -(pgVar2->m[6].n == 0x8d);
    auVar89[7] = -(pgVar2->m[7].n == 0x8d);
    auVar89[8] = -(pgVar2->m[8].n == 0x8d);
    auVar89[9] = -(pgVar2->m[9].n == 0x8d);
    auVar89[10] = -(pgVar2->m[10].n == 0x8d);
    auVar89[0xb] = -(pgVar2->m[0xb].n == 0x8d);
    auVar89[0xc] = -(pgVar2->m[0xc].n == 0x8d);
    auVar89[0xd] = -(pgVar2->m[0xd].n == 0x8d);
    auVar89[0xe] = -(pgVar2->m[0xe].n == 0x8d);
    auVar89[0xf] = -(pgVar2->m[0xf].n == 0x8d);
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar89 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar89 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar89 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar89 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar89 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar89 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar89 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar89 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar89 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar89 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar89 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar89 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar89 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar89 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar89 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(int *)((long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0x1a5) {
        lVar53 = (long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f16f0;
      }
    }
    if ((pgVar6[uVar54].m[0xf].n & 0x20) == 0) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f16f0:
  if (lVar53 == 0) {
    if ((local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.size <
        (local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,(arrays_type *)this_00,uVar18,0x313b2e0e557e0f8d,&local_171,
                 (SyntaxKind *)&local_168);
      psVar1 = &(local_170->knownTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      local_168._M_len._0_4_ = uVar15;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,0x313b2e0e557e0f8d,&local_171,(SyntaxKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  *(undefined8 *)(lVar53 + 8) = 0x5d43d8;
  local_168._M_len._0_4_ = 0x180;
  uVar15 = (undefined4)local_168._M_len;
  local_168._M_len._0_4_ = 0x180;
  uVar18 = 0x5336963eefba1f6d >>
           ((byte)(local_170->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar6 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_;
  ppVar44 = (local_170->knownTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar2 = pgVar6 + uVar54;
    auVar90[0] = -(pgVar2->m[0].n == 'm');
    auVar90[1] = -(pgVar2->m[1].n == 'm');
    auVar90[2] = -(pgVar2->m[2].n == 'm');
    auVar90[3] = -(pgVar2->m[3].n == 'm');
    auVar90[4] = -(pgVar2->m[4].n == 'm');
    auVar90[5] = -(pgVar2->m[5].n == 'm');
    auVar90[6] = -(pgVar2->m[6].n == 'm');
    auVar90[7] = -(pgVar2->m[7].n == 'm');
    auVar90[8] = -(pgVar2->m[8].n == 'm');
    auVar90[9] = -(pgVar2->m[9].n == 'm');
    auVar90[10] = -(pgVar2->m[10].n == 'm');
    auVar90[0xb] = -(pgVar2->m[0xb].n == 'm');
    auVar90[0xc] = -(pgVar2->m[0xc].n == 'm');
    auVar90[0xd] = -(pgVar2->m[0xd].n == 'm');
    auVar90[0xe] = -(pgVar2->m[0xe].n == 'm');
    auVar90[0xf] = -(pgVar2->m[0xf].n == 'm');
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar90 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar90 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar90 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar90 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar90 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar90 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar90 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar90 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar90 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar90 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar90 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar90 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar90 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar90 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar90 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(int *)((long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0x180) {
        lVar53 = (long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f1822;
      }
    }
    if ((pgVar6[uVar54].m[0xf].n & 0x20) == 0) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f1822:
  if (lVar53 == 0) {
    if ((local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.size <
        (local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,(arrays_type *)this_00,uVar18,0x5336963eefba1f6d,&local_171,
                 (SyntaxKind *)&local_168);
      psVar1 = &(local_170->knownTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      local_168._M_len._0_4_ = uVar15;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,0x5336963eefba1f6d,&local_171,(SyntaxKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  *(undefined8 *)(lVar53 + 8) = 0x5d4420;
  pTVar7 = local_170->errorType;
  local_168._M_len = (ulong)local_168._M_len._4_4_ << 0x20;
  uVar52 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  pgVar6 = (local_170->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_;
  ppVar44 = (local_170->knownTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
            .arrays.elements_;
  uVar54 = 0;
  uVar18 = 0;
  do {
    pgVar2 = pgVar6 + uVar54;
    auVar66[0] = -(pgVar2->m[0].n == '\b');
    auVar66[1] = -(pgVar2->m[1].n == '\b');
    auVar66[2] = -(pgVar2->m[2].n == '\b');
    auVar66[3] = -(pgVar2->m[3].n == '\b');
    auVar66[4] = -(pgVar2->m[4].n == '\b');
    auVar66[5] = -(pgVar2->m[5].n == '\b');
    auVar66[6] = -(pgVar2->m[6].n == '\b');
    auVar66[7] = -(pgVar2->m[7].n == '\b');
    auVar66[8] = -(pgVar2->m[8].n == '\b');
    auVar66[9] = -(pgVar2->m[9].n == '\b');
    auVar66[10] = -(pgVar2->m[10].n == '\b');
    auVar66[0xb] = -(pgVar2->m[0xb].n == '\b');
    auVar66[0xc] = -(pgVar2->m[0xc].n == '\b');
    auVar66[0xd] = -(pgVar2->m[0xd].n == '\b');
    auVar66[0xe] = -(pgVar2->m[0xe].n == '\b');
    auVar66[0xf] = -(pgVar2->m[0xf].n == '\b');
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar66 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar66 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar66 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar66 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar66 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar66 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar66 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar66 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar66 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar66 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar66 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar66 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar66 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar66 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar66 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(int *)((long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0) {
        lVar53 = (long)&ppVar44[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f1945;
      }
    }
    if ((pgVar6[uVar54].m[0xf].n & 1) == 0) break;
    lVar53 = uVar54 + uVar18;
    uVar18 = uVar18 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar18 <= uVar52);
  lVar53 = 0;
LAB_001f1945:
  if (lVar53 == 0) {
    if ((local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.size <
        (local_170->knownTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,(arrays_type *)this_00,0,0,&local_171,(SyntaxKind *)&local_168);
      psVar1 = &(local_170->knownTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                  *)this_00,0,&local_171,(SyntaxKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  *(Type **)(lVar53 + 8) = pTVar7;
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::parsing::TokenKind,_void>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
  ::rehash(local_138,0x13);
  sVar116 = parsing::LexerFacts::getTokenKindText(WireKeyword);
  pTVar7 = local_170->logicType;
  pNVar19 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar19,Wire,sVar116,pTVar7);
  local_168._M_len = CONCAT62(local_168._M_len._2_6_,0x14f);
  uVar18 = 0xa9849bd92785fb4 >>
           ((byte)(local_170->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar8 = (local_170->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_;
  ppVar45 = (local_170->knownNetTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar3 = pgVar8 + uVar54;
    auVar67[0] = -(pgVar3->m[0].n == 0xb4);
    auVar67[1] = -(pgVar3->m[1].n == 0xb4);
    auVar67[2] = -(pgVar3->m[2].n == 0xb4);
    auVar67[3] = -(pgVar3->m[3].n == 0xb4);
    auVar67[4] = -(pgVar3->m[4].n == 0xb4);
    auVar67[5] = -(pgVar3->m[5].n == 0xb4);
    auVar67[6] = -(pgVar3->m[6].n == 0xb4);
    auVar67[7] = -(pgVar3->m[7].n == 0xb4);
    auVar67[8] = -(pgVar3->m[8].n == 0xb4);
    auVar67[9] = -(pgVar3->m[9].n == 0xb4);
    auVar67[10] = -(pgVar3->m[10].n == 0xb4);
    auVar67[0xb] = -(pgVar3->m[0xb].n == 0xb4);
    auVar67[0xc] = -(pgVar3->m[0xc].n == 0xb4);
    auVar67[0xd] = -(pgVar3->m[0xd].n == 0xb4);
    auVar67[0xe] = -(pgVar3->m[0xe].n == 0xb4);
    auVar67[0xf] = -(pgVar3->m[0xf].n == 0xb4);
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar67 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar67 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar67 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar67 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar67 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar67 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar67 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar67 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar67 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar67 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar67 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar67 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar67 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar67 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar67 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(short *)((long)&ppVar45[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0x14f) {
        lVar53 = (long)&ppVar45[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f1ac5;
      }
    }
    if ((pgVar8[uVar54].m[0xf].n & 0x10) == 0) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f1ac5:
  if (lVar53 == 0) {
    if ((local_170->knownNetTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
        .size_ctrl.size <
        (local_170->knownNetTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                  *)local_138,&local_138->arrays,uVar18,0xa9849bd92785fb4,&local_171,
                 (TokenKind *)&local_168);
      psVar1 = &(local_170->knownNetTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                  *)local_138,0xa9849bd92785fb4,&local_171,(TokenKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  pvVar9 = *(void **)(lVar53 + 8);
  *(NetType **)(lVar53 + 8) = pNVar19;
  if (pvVar9 != (void *)0x0) {
    operator_delete(pvVar9,0x98);
  }
  sVar116 = parsing::LexerFacts::getTokenKindText(WAndKeyword);
  pTVar7 = local_170->logicType;
  pNVar19 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar19,WAnd,sVar116,pTVar7);
  local_168._M_len = CONCAT62(local_168._M_len._2_6_,0x149);
  uVar18 = 0x554b6f6496b97636 >>
           ((byte)(local_170->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar8 = (local_170->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_;
  ppVar45 = (local_170->knownNetTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar3 = pgVar8 + uVar54;
    auVar91[0] = -(pgVar3->m[0].n == '6');
    auVar91[1] = -(pgVar3->m[1].n == '6');
    auVar91[2] = -(pgVar3->m[2].n == '6');
    auVar91[3] = -(pgVar3->m[3].n == '6');
    auVar91[4] = -(pgVar3->m[4].n == '6');
    auVar91[5] = -(pgVar3->m[5].n == '6');
    auVar91[6] = -(pgVar3->m[6].n == '6');
    auVar91[7] = -(pgVar3->m[7].n == '6');
    auVar91[8] = -(pgVar3->m[8].n == '6');
    auVar91[9] = -(pgVar3->m[9].n == '6');
    auVar91[10] = -(pgVar3->m[10].n == '6');
    auVar91[0xb] = -(pgVar3->m[0xb].n == '6');
    auVar91[0xc] = -(pgVar3->m[0xc].n == '6');
    auVar91[0xd] = -(pgVar3->m[0xd].n == '6');
    auVar91[0xe] = -(pgVar3->m[0xe].n == '6');
    auVar91[0xf] = -(pgVar3->m[0xf].n == '6');
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar91 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar91 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar91 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar91 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar91 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar91 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar91 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar91 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar91 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar91 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar91 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar91 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar91 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar91 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar91 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(short *)((long)&ppVar45[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0x149) {
        lVar53 = (long)&ppVar45[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f1c48;
      }
    }
    if ((pgVar8[uVar54].m[0xf].n & 0x40) == 0) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f1c48:
  if (lVar53 == 0) {
    if ((local_170->knownNetTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
        .size_ctrl.size <
        (local_170->knownNetTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                  *)local_138,&local_138->arrays,uVar18,0x554b6f6496b97636,&local_171,
                 (TokenKind *)&local_168);
      psVar1 = &(local_170->knownNetTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                  *)local_138,0x554b6f6496b97636,&local_171,(TokenKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  pvVar9 = *(void **)(lVar53 + 8);
  *(NetType **)(lVar53 + 8) = pNVar19;
  if (pvVar9 != (void *)0x0) {
    operator_delete(pvVar9,0x98);
  }
  sVar116 = parsing::LexerFacts::getTokenKindText(WOrKeyword);
  pTVar7 = local_170->logicType;
  pNVar19 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar19,WOr,sVar116,pTVar7);
  local_168._M_len = CONCAT62(local_168._M_len._2_6_,0x152);
  uVar18 = 0xe53eb6ea1057d36a >>
           ((byte)(local_170->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar8 = (local_170->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_;
  ppVar45 = (local_170->knownNetTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar3 = pgVar8 + uVar54;
    auVar92[0] = -(pgVar3->m[0].n == 'j');
    auVar92[1] = -(pgVar3->m[1].n == 'j');
    auVar92[2] = -(pgVar3->m[2].n == 'j');
    auVar92[3] = -(pgVar3->m[3].n == 'j');
    auVar92[4] = -(pgVar3->m[4].n == 'j');
    auVar92[5] = -(pgVar3->m[5].n == 'j');
    auVar92[6] = -(pgVar3->m[6].n == 'j');
    auVar92[7] = -(pgVar3->m[7].n == 'j');
    auVar92[8] = -(pgVar3->m[8].n == 'j');
    auVar92[9] = -(pgVar3->m[9].n == 'j');
    auVar92[10] = -(pgVar3->m[10].n == 'j');
    auVar92[0xb] = -(pgVar3->m[0xb].n == 'j');
    auVar92[0xc] = -(pgVar3->m[0xc].n == 'j');
    auVar92[0xd] = -(pgVar3->m[0xd].n == 'j');
    auVar92[0xe] = -(pgVar3->m[0xe].n == 'j');
    auVar92[0xf] = -(pgVar3->m[0xf].n == 'j');
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar92 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar92 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar92 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar92 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar92 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar92 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar92 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar92 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar92 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar92 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar92 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar92 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar92 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar92 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar92 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(short *)((long)&ppVar45[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0x152) {
        lVar53 = (long)&ppVar45[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f1dcb;
      }
    }
    if ((pgVar8[uVar54].m[0xf].n & 4) == 0) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f1dcb:
  if (lVar53 == 0) {
    if ((local_170->knownNetTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
        .size_ctrl.size <
        (local_170->knownNetTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                  *)local_138,&local_138->arrays,uVar18,0xe53eb6ea1057d36a,&local_171,
                 (TokenKind *)&local_168);
      psVar1 = &(local_170->knownNetTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                  *)local_138,0xe53eb6ea1057d36a,&local_171,(TokenKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  pvVar9 = *(void **)(lVar53 + 8);
  *(NetType **)(lVar53 + 8) = pNVar19;
  if (pvVar9 != (void *)0x0) {
    operator_delete(pvVar9,0x98);
  }
  sVar116 = parsing::LexerFacts::getTokenKindText(TriKeyword);
  pTVar7 = local_170->logicType;
  pNVar19 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar19,Tri,sVar116,pTVar7);
  local_168._M_len = CONCAT62(local_168._M_len._2_6_,0x132);
  uVar18 = 0x1e4f7fba270851a7 >>
           ((byte)(local_170->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar8 = (local_170->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_;
  ppVar45 = (local_170->knownNetTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar3 = pgVar8 + uVar54;
    auVar93[0] = -(pgVar3->m[0].n == 0xa7);
    auVar93[1] = -(pgVar3->m[1].n == 0xa7);
    auVar93[2] = -(pgVar3->m[2].n == 0xa7);
    auVar93[3] = -(pgVar3->m[3].n == 0xa7);
    auVar93[4] = -(pgVar3->m[4].n == 0xa7);
    auVar93[5] = -(pgVar3->m[5].n == 0xa7);
    auVar93[6] = -(pgVar3->m[6].n == 0xa7);
    auVar93[7] = -(pgVar3->m[7].n == 0xa7);
    auVar93[8] = -(pgVar3->m[8].n == 0xa7);
    auVar93[9] = -(pgVar3->m[9].n == 0xa7);
    auVar93[10] = -(pgVar3->m[10].n == 0xa7);
    auVar93[0xb] = -(pgVar3->m[0xb].n == 0xa7);
    auVar93[0xc] = -(pgVar3->m[0xc].n == 0xa7);
    auVar93[0xd] = -(pgVar3->m[0xd].n == 0xa7);
    auVar93[0xe] = -(pgVar3->m[0xe].n == 0xa7);
    auVar93[0xf] = -(pgVar3->m[0xf].n == 0xa7);
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar93 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar93 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar93 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar93 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar93 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar93 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar93 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar93 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar93 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar93 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar93 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar93 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar93 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar93 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar93 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(short *)((long)&ppVar45[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0x132) {
        lVar53 = (long)&ppVar45[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f1f4e;
      }
    }
    if (-1 < (char)pgVar8[uVar54].m[0xf].n) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f1f4e:
  if (lVar53 == 0) {
    if ((local_170->knownNetTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
        .size_ctrl.size <
        (local_170->knownNetTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                  *)local_138,&local_138->arrays,uVar18,0x1e4f7fba270851a7,&local_171,
                 (TokenKind *)&local_168);
      psVar1 = &(local_170->knownNetTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                  *)local_138,0x1e4f7fba270851a7,&local_171,(TokenKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  pvVar9 = *(void **)(lVar53 + 8);
  *(NetType **)(lVar53 + 8) = pNVar19;
  if (pvVar9 != (void *)0x0) {
    operator_delete(pvVar9,0x98);
  }
  sVar116 = parsing::LexerFacts::getTokenKindText(TriAndKeyword);
  pTVar7 = local_170->logicType;
  pNVar19 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar19,TriAnd,sVar116,pTVar7);
  local_168._M_len = CONCAT62(local_168._M_len._2_6_,0x135);
  uVar18 = 0xf8f5ece6a4e7c5e7 >>
           ((byte)(local_170->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar8 = (local_170->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_;
  ppVar45 = (local_170->knownNetTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar3 = pgVar8 + uVar54;
    auVar94[0] = -(pgVar3->m[0].n == 0xe7);
    auVar94[1] = -(pgVar3->m[1].n == 0xe7);
    auVar94[2] = -(pgVar3->m[2].n == 0xe7);
    auVar94[3] = -(pgVar3->m[3].n == 0xe7);
    auVar94[4] = -(pgVar3->m[4].n == 0xe7);
    auVar94[5] = -(pgVar3->m[5].n == 0xe7);
    auVar94[6] = -(pgVar3->m[6].n == 0xe7);
    auVar94[7] = -(pgVar3->m[7].n == 0xe7);
    auVar94[8] = -(pgVar3->m[8].n == 0xe7);
    auVar94[9] = -(pgVar3->m[9].n == 0xe7);
    auVar94[10] = -(pgVar3->m[10].n == 0xe7);
    auVar94[0xb] = -(pgVar3->m[0xb].n == 0xe7);
    auVar94[0xc] = -(pgVar3->m[0xc].n == 0xe7);
    auVar94[0xd] = -(pgVar3->m[0xd].n == 0xe7);
    auVar94[0xe] = -(pgVar3->m[0xe].n == 0xe7);
    auVar94[0xf] = -(pgVar3->m[0xf].n == 0xe7);
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar94 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar94 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar94 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar94 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar94 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar94 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar94 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar94 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar94 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar94 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar94 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar94 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar94 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar94 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar94 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(short *)((long)&ppVar45[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0x135) {
        lVar53 = (long)&ppVar45[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f20d1;
      }
    }
    if (-1 < (char)pgVar8[uVar54].m[0xf].n) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f20d1:
  if (lVar53 == 0) {
    if ((local_170->knownNetTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
        .size_ctrl.size <
        (local_170->knownNetTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                  *)local_138,&local_138->arrays,uVar18,0xf8f5ece6a4e7c5e7,&local_171,
                 (TokenKind *)&local_168);
      psVar1 = &(local_170->knownNetTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                  *)local_138,0xf8f5ece6a4e7c5e7,&local_171,(TokenKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  pvVar9 = *(void **)(lVar53 + 8);
  *(NetType **)(lVar53 + 8) = pNVar19;
  if (pvVar9 != (void *)0x0) {
    operator_delete(pvVar9,0x98);
  }
  sVar116 = parsing::LexerFacts::getTokenKindText(TriOrKeyword);
  pTVar7 = local_170->logicType;
  pNVar19 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar19,TriOr,sVar116,pTVar7);
  local_168._M_len = CONCAT62(local_168._M_len._2_6_,0x136);
  uVar18 = 0x972d66a0243241d1 >>
           ((byte)(local_170->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar8 = (local_170->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_;
  ppVar45 = (local_170->knownNetTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar3 = pgVar8 + uVar54;
    auVar68[0] = -(pgVar3->m[0].n == 0xd1);
    auVar68[1] = -(pgVar3->m[1].n == 0xd1);
    auVar68[2] = -(pgVar3->m[2].n == 0xd1);
    auVar68[3] = -(pgVar3->m[3].n == 0xd1);
    auVar68[4] = -(pgVar3->m[4].n == 0xd1);
    auVar68[5] = -(pgVar3->m[5].n == 0xd1);
    auVar68[6] = -(pgVar3->m[6].n == 0xd1);
    auVar68[7] = -(pgVar3->m[7].n == 0xd1);
    auVar68[8] = -(pgVar3->m[8].n == 0xd1);
    auVar68[9] = -(pgVar3->m[9].n == 0xd1);
    auVar68[10] = -(pgVar3->m[10].n == 0xd1);
    auVar68[0xb] = -(pgVar3->m[0xb].n == 0xd1);
    auVar68[0xc] = -(pgVar3->m[0xc].n == 0xd1);
    auVar68[0xd] = -(pgVar3->m[0xd].n == 0xd1);
    auVar68[0xe] = -(pgVar3->m[0xe].n == 0xd1);
    auVar68[0xf] = -(pgVar3->m[0xf].n == 0xd1);
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar68 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar68 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar68 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar68 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar68 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar68 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar68 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar68 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar68 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar68 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar68 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar68 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar68 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar68 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar68 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(short *)((long)&ppVar45[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0x136) {
        lVar53 = (long)&ppVar45[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f2250;
      }
    }
    if ((pgVar8[uVar54].m[0xf].n & 2) == 0) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f2250:
  if (lVar53 == 0) {
    if ((local_170->knownNetTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
        .size_ctrl.size <
        (local_170->knownNetTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                  *)local_138,&local_138->arrays,uVar18,0x972d66a0243241d1,&local_171,
                 (TokenKind *)&local_168);
      psVar1 = &(local_170->knownNetTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                  *)local_138,0x972d66a0243241d1,&local_171,(TokenKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  pvVar9 = *(void **)(lVar53 + 8);
  *(NetType **)(lVar53 + 8) = pNVar19;
  if (pvVar9 != (void *)0x0) {
    operator_delete(pvVar9,0x98);
  }
  sVar116 = parsing::LexerFacts::getTokenKindText(Tri0Keyword);
  pTVar7 = local_170->logicType;
  pNVar19 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar19,Tri0,sVar116,pTVar7);
  local_168._M_len = CONCAT62(local_168._M_len._2_6_,0x133);
  uVar18 = 0xbc86f973a652cd92 >>
           ((byte)(local_170->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar8 = (local_170->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_;
  ppVar45 = (local_170->knownNetTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar3 = pgVar8 + uVar54;
    auVar69[0] = -(pgVar3->m[0].n == 0x92);
    auVar69[1] = -(pgVar3->m[1].n == 0x92);
    auVar69[2] = -(pgVar3->m[2].n == 0x92);
    auVar69[3] = -(pgVar3->m[3].n == 0x92);
    auVar69[4] = -(pgVar3->m[4].n == 0x92);
    auVar69[5] = -(pgVar3->m[5].n == 0x92);
    auVar69[6] = -(pgVar3->m[6].n == 0x92);
    auVar69[7] = -(pgVar3->m[7].n == 0x92);
    auVar69[8] = -(pgVar3->m[8].n == 0x92);
    auVar69[9] = -(pgVar3->m[9].n == 0x92);
    auVar69[10] = -(pgVar3->m[10].n == 0x92);
    auVar69[0xb] = -(pgVar3->m[0xb].n == 0x92);
    auVar69[0xc] = -(pgVar3->m[0xc].n == 0x92);
    auVar69[0xd] = -(pgVar3->m[0xd].n == 0x92);
    auVar69[0xe] = -(pgVar3->m[0xe].n == 0x92);
    auVar69[0xf] = -(pgVar3->m[0xf].n == 0x92);
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar69 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar69 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar69 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar69 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar69 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar69 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar69 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar69 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar69 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar69 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar69 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar69 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar69 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar69 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar69 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(short *)((long)&ppVar45[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0x133) {
        lVar53 = (long)&ppVar45[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f23cf;
      }
    }
    if ((pgVar8[uVar54].m[0xf].n & 4) == 0) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f23cf:
  if (lVar53 == 0) {
    if ((local_170->knownNetTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
        .size_ctrl.size <
        (local_170->knownNetTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                  *)local_138,&local_138->arrays,uVar18,0xbc86f973a652cd92,&local_171,
                 (TokenKind *)&local_168);
      psVar1 = &(local_170->knownNetTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                  *)local_138,0xbc86f973a652cd92,&local_171,(TokenKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  pvVar9 = *(void **)(lVar53 + 8);
  *(NetType **)(lVar53 + 8) = pNVar19;
  if (pvVar9 != (void *)0x0) {
    operator_delete(pvVar9,0x98);
  }
  sVar116 = parsing::LexerFacts::getTokenKindText(Tri1Keyword);
  pTVar7 = local_170->logicType;
  pNVar19 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar19,Tri1,sVar116,pTVar7);
  local_168._M_len = CONCAT62(local_168._M_len._2_6_,0x134);
  uVar18 = 0x5abe732d259d49fa >>
           ((byte)(local_170->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar8 = (local_170->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_;
  ppVar45 = (local_170->knownNetTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar3 = pgVar8 + uVar54;
    auVar95[0] = -(pgVar3->m[0].n == 0xfa);
    auVar95[1] = -(pgVar3->m[1].n == 0xfa);
    auVar95[2] = -(pgVar3->m[2].n == 0xfa);
    auVar95[3] = -(pgVar3->m[3].n == 0xfa);
    auVar95[4] = -(pgVar3->m[4].n == 0xfa);
    auVar95[5] = -(pgVar3->m[5].n == 0xfa);
    auVar95[6] = -(pgVar3->m[6].n == 0xfa);
    auVar95[7] = -(pgVar3->m[7].n == 0xfa);
    auVar95[8] = -(pgVar3->m[8].n == 0xfa);
    auVar95[9] = -(pgVar3->m[9].n == 0xfa);
    auVar95[10] = -(pgVar3->m[10].n == 0xfa);
    auVar95[0xb] = -(pgVar3->m[0xb].n == 0xfa);
    auVar95[0xc] = -(pgVar3->m[0xc].n == 0xfa);
    auVar95[0xd] = -(pgVar3->m[0xd].n == 0xfa);
    auVar95[0xe] = -(pgVar3->m[0xe].n == 0xfa);
    auVar95[0xf] = -(pgVar3->m[0xf].n == 0xfa);
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar95 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar95 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar95 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar95 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar95 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar95 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar95 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar95 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar95 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar95 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar95 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar95 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar95 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar95 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar95 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(short *)((long)&ppVar45[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0x134) {
        lVar53 = (long)&ppVar45[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f2552;
      }
    }
    if ((pgVar8[uVar54].m[0xf].n & 4) == 0) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f2552:
  if (lVar53 == 0) {
    if ((local_170->knownNetTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
        .size_ctrl.size <
        (local_170->knownNetTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                  *)local_138,&local_138->arrays,uVar18,0x5abe732d259d49fa,&local_171,
                 (TokenKind *)&local_168);
      psVar1 = &(local_170->knownNetTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                  *)local_138,0x5abe732d259d49fa,&local_171,(TokenKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  pvVar9 = *(void **)(lVar53 + 8);
  *(NetType **)(lVar53 + 8) = pNVar19;
  if (pvVar9 != (void *)0x0) {
    operator_delete(pvVar9,0x98);
  }
  sVar116 = parsing::LexerFacts::getTokenKindText(TriRegKeyword);
  pTVar7 = local_170->logicType;
  pNVar19 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar19,TriReg,sVar116,pTVar7);
  local_168._M_len = CONCAT62(local_168._M_len._2_6_,0x137);
  uVar18 = 0x3564e059a37cbd43 >>
           ((byte)(local_170->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar8 = (local_170->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_;
  ppVar45 = (local_170->knownNetTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar3 = pgVar8 + uVar54;
    auVar96[0] = -(pgVar3->m[0].n == 'C');
    auVar96[1] = -(pgVar3->m[1].n == 'C');
    auVar96[2] = -(pgVar3->m[2].n == 'C');
    auVar96[3] = -(pgVar3->m[3].n == 'C');
    auVar96[4] = -(pgVar3->m[4].n == 'C');
    auVar96[5] = -(pgVar3->m[5].n == 'C');
    auVar96[6] = -(pgVar3->m[6].n == 'C');
    auVar96[7] = -(pgVar3->m[7].n == 'C');
    auVar96[8] = -(pgVar3->m[8].n == 'C');
    auVar96[9] = -(pgVar3->m[9].n == 'C');
    auVar96[10] = -(pgVar3->m[10].n == 'C');
    auVar96[0xb] = -(pgVar3->m[0xb].n == 'C');
    auVar96[0xc] = -(pgVar3->m[0xc].n == 'C');
    auVar96[0xd] = -(pgVar3->m[0xd].n == 'C');
    auVar96[0xe] = -(pgVar3->m[0xe].n == 'C');
    auVar96[0xf] = -(pgVar3->m[0xf].n == 'C');
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar96 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar96 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar96 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar96 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar96 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar96 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar96 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar96 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar96 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar96 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar96 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar96 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar96 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar96 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar96 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(short *)((long)&ppVar45[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0x137) {
        lVar53 = (long)&ppVar45[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f26d5;
      }
    }
    if ((pgVar8[uVar54].m[0xf].n & 8) == 0) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f26d5:
  if (lVar53 == 0) {
    if ((local_170->knownNetTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
        .size_ctrl.size <
        (local_170->knownNetTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                  *)local_138,&local_138->arrays,uVar18,0x3564e059a37cbd43,&local_171,
                 (TokenKind *)&local_168);
      psVar1 = &(local_170->knownNetTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                  *)local_138,0x3564e059a37cbd43,&local_171,(TokenKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  pvVar9 = *(void **)(lVar53 + 8);
  *(NetType **)(lVar53 + 8) = pNVar19;
  if (pvVar9 != (void *)0x0) {
    operator_delete(pvVar9,0x98);
  }
  sVar116 = parsing::LexerFacts::getTokenKindText(Supply0Keyword);
  pTVar7 = local_170->logicType;
  pNVar19 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar19,Supply0,sVar116,pTVar7);
  local_168._M_len = CONCAT62(local_168._M_len._2_6_,0x123);
  uVar18 = 0xd90f5ddbb1ab0b6c >>
           ((byte)(local_170->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar8 = (local_170->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_;
  ppVar45 = (local_170->knownNetTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar3 = pgVar8 + uVar54;
    auVar97[0] = -(pgVar3->m[0].n == 'l');
    auVar97[1] = -(pgVar3->m[1].n == 'l');
    auVar97[2] = -(pgVar3->m[2].n == 'l');
    auVar97[3] = -(pgVar3->m[3].n == 'l');
    auVar97[4] = -(pgVar3->m[4].n == 'l');
    auVar97[5] = -(pgVar3->m[5].n == 'l');
    auVar97[6] = -(pgVar3->m[6].n == 'l');
    auVar97[7] = -(pgVar3->m[7].n == 'l');
    auVar97[8] = -(pgVar3->m[8].n == 'l');
    auVar97[9] = -(pgVar3->m[9].n == 'l');
    auVar97[10] = -(pgVar3->m[10].n == 'l');
    auVar97[0xb] = -(pgVar3->m[0xb].n == 'l');
    auVar97[0xc] = -(pgVar3->m[0xc].n == 'l');
    auVar97[0xd] = -(pgVar3->m[0xd].n == 'l');
    auVar97[0xe] = -(pgVar3->m[0xe].n == 'l');
    auVar97[0xf] = -(pgVar3->m[0xf].n == 'l');
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar97 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar97 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar97 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar97 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar97 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar97 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar97 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar97 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar97 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar97 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar97 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar97 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar97 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar97 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar97 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(short *)((long)&ppVar45[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0x123) {
        lVar53 = (long)&ppVar45[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f2858;
      }
    }
    if ((pgVar8[uVar54].m[0xf].n & 0x10) == 0) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f2858:
  if (lVar53 == 0) {
    if ((local_170->knownNetTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
        .size_ctrl.size <
        (local_170->knownNetTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                  *)local_138,&local_138->arrays,uVar18,0xd90f5ddbb1ab0b6c,&local_171,
                 (TokenKind *)&local_168);
      psVar1 = &(local_170->knownNetTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                  *)local_138,0xd90f5ddbb1ab0b6c,&local_171,(TokenKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  pvVar9 = *(void **)(lVar53 + 8);
  *(NetType **)(lVar53 + 8) = pNVar19;
  if (pvVar9 != (void *)0x0) {
    operator_delete(pvVar9,0x98);
  }
  sVar116 = parsing::LexerFacts::getTokenKindText(Supply1Keyword);
  pTVar7 = local_170->logicType;
  pNVar19 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar19,Supply1,sVar116,pTVar7);
  local_168._M_len = CONCAT62(local_168._M_len._2_6_,0x124);
  uVar18 = 0x7746d79530f58740 >>
           ((byte)(local_170->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar8 = (local_170->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_;
  ppVar45 = (local_170->knownNetTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar3 = pgVar8 + uVar54;
    auVar98[0] = -(pgVar3->m[0].n == '@');
    auVar98[1] = -(pgVar3->m[1].n == '@');
    auVar98[2] = -(pgVar3->m[2].n == '@');
    auVar98[3] = -(pgVar3->m[3].n == '@');
    auVar98[4] = -(pgVar3->m[4].n == '@');
    auVar98[5] = -(pgVar3->m[5].n == '@');
    auVar98[6] = -(pgVar3->m[6].n == '@');
    auVar98[7] = -(pgVar3->m[7].n == '@');
    auVar98[8] = -(pgVar3->m[8].n == '@');
    auVar98[9] = -(pgVar3->m[9].n == '@');
    auVar98[10] = -(pgVar3->m[10].n == '@');
    auVar98[0xb] = -(pgVar3->m[0xb].n == '@');
    auVar98[0xc] = -(pgVar3->m[0xc].n == '@');
    auVar98[0xd] = -(pgVar3->m[0xd].n == '@');
    auVar98[0xe] = -(pgVar3->m[0xe].n == '@');
    auVar98[0xf] = -(pgVar3->m[0xf].n == '@');
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar98 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar98 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar98 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar98 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar98 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar98 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar98 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar98 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar98 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar98 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar98 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar98 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar98 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar98 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar98 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(short *)((long)&ppVar45[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0x124) {
        lVar53 = (long)&ppVar45[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f29db;
      }
    }
    if ((pgVar8[uVar54].m[0xf].n & 1) == 0) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f29db:
  if (lVar53 == 0) {
    if ((local_170->knownNetTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
        .size_ctrl.size <
        (local_170->knownNetTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                  *)local_138,&local_138->arrays,uVar18,0x7746d79530f58740,&local_171,
                 (TokenKind *)&local_168);
      psVar1 = &(local_170->knownNetTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                  *)local_138,0x7746d79530f58740,&local_171,(TokenKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  pvVar9 = *(void **)(lVar53 + 8);
  *(NetType **)(lVar53 + 8) = pNVar19;
  if (pvVar9 != (void *)0x0) {
    operator_delete(pvVar9,0x98);
  }
  sVar116 = parsing::LexerFacts::getTokenKindText(UWireKeyword);
  pTVar7 = local_170->logicType;
  pNVar19 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar19,UWire,sVar116,pTVar7);
  local_168._M_len = CONCAT62(local_168._M_len._2_6_,0x142);
  uVar18 = 0x1c71b521bb012ad >>
           ((byte)(local_170->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar8 = (local_170->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_;
  ppVar45 = (local_170->knownNetTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar3 = pgVar8 + uVar54;
    auVar99[0] = -(pgVar3->m[0].n == 0xad);
    auVar99[1] = -(pgVar3->m[1].n == 0xad);
    auVar99[2] = -(pgVar3->m[2].n == 0xad);
    auVar99[3] = -(pgVar3->m[3].n == 0xad);
    auVar99[4] = -(pgVar3->m[4].n == 0xad);
    auVar99[5] = -(pgVar3->m[5].n == 0xad);
    auVar99[6] = -(pgVar3->m[6].n == 0xad);
    auVar99[7] = -(pgVar3->m[7].n == 0xad);
    auVar99[8] = -(pgVar3->m[8].n == 0xad);
    auVar99[9] = -(pgVar3->m[9].n == 0xad);
    auVar99[10] = -(pgVar3->m[10].n == 0xad);
    auVar99[0xb] = -(pgVar3->m[0xb].n == 0xad);
    auVar99[0xc] = -(pgVar3->m[0xc].n == 0xad);
    auVar99[0xd] = -(pgVar3->m[0xd].n == 0xad);
    auVar99[0xe] = -(pgVar3->m[0xe].n == 0xad);
    auVar99[0xf] = -(pgVar3->m[0xf].n == 0xad);
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar99 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar99 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar99 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar99 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar99 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar99 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar99 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar99 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar99 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar99 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar99 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar99 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar99 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar99 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar99 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(short *)((long)&ppVar45[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0x142) {
        lVar53 = (long)&ppVar45[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f2b5e;
      }
    }
    if ((pgVar8[uVar54].m[0xf].n & 0x20) == 0) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f2b5e:
  if (lVar53 == 0) {
    if ((local_170->knownNetTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
        .size_ctrl.size <
        (local_170->knownNetTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                  *)local_138,&local_138->arrays,uVar18,0x1c71b521bb012ad,&local_171,
                 (TokenKind *)&local_168);
      psVar1 = &(local_170->knownNetTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                  *)local_138,0x1c71b521bb012ad,&local_171,(TokenKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  pvVar9 = *(void **)(lVar53 + 8);
  *(NetType **)(lVar53 + 8) = pNVar19;
  if (pvVar9 != (void *)0x0) {
    operator_delete(pvVar9,0x98);
  }
  sVar116 = parsing::LexerFacts::getTokenKindText(InterconnectKeyword);
  pTVar7 = local_170->logicType;
  pNVar19 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar19,Interconnect,sVar116,pTVar7);
  local_168._M_len = CONCAT62(local_168._M_len._2_6_,199);
  uVar18 = 0xfd1f9f31f2e67429 >>
           ((byte)(local_170->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar8 = (local_170->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_;
  ppVar45 = (local_170->knownNetTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar3 = pgVar8 + uVar54;
    auVar100[0] = -(pgVar3->m[0].n == ')');
    auVar100[1] = -(pgVar3->m[1].n == ')');
    auVar100[2] = -(pgVar3->m[2].n == ')');
    auVar100[3] = -(pgVar3->m[3].n == ')');
    auVar100[4] = -(pgVar3->m[4].n == ')');
    auVar100[5] = -(pgVar3->m[5].n == ')');
    auVar100[6] = -(pgVar3->m[6].n == ')');
    auVar100[7] = -(pgVar3->m[7].n == ')');
    auVar100[8] = -(pgVar3->m[8].n == ')');
    auVar100[9] = -(pgVar3->m[9].n == ')');
    auVar100[10] = -(pgVar3->m[10].n == ')');
    auVar100[0xb] = -(pgVar3->m[0xb].n == ')');
    auVar100[0xc] = -(pgVar3->m[0xc].n == ')');
    auVar100[0xd] = -(pgVar3->m[0xd].n == ')');
    auVar100[0xe] = -(pgVar3->m[0xe].n == ')');
    auVar100[0xf] = -(pgVar3->m[0xf].n == ')');
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar100 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar100 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar100 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar100 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar100 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar100 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar100 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar100 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar100 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar100 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar100 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar100 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar100 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar100 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar100 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(short *)((long)&ppVar45[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 199) {
        lVar53 = (long)&ppVar45[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f2ce1;
      }
    }
    if ((pgVar8[uVar54].m[0xf].n & 2) == 0) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f2ce1:
  if (lVar53 == 0) {
    if ((local_170->knownNetTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
        .size_ctrl.size <
        (local_170->knownNetTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                  *)local_138,&local_138->arrays,uVar18,0xfd1f9f31f2e67429,&local_171,
                 (TokenKind *)&local_168);
      psVar1 = &(local_170->knownNetTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                  *)local_138,0xfd1f9f31f2e67429,&local_171,(TokenKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  pvVar9 = *(void **)(lVar53 + 8);
  *(NetType **)(lVar53 + 8) = pNVar19;
  if (pvVar9 != (void *)0x0) {
    operator_delete(pvVar9,0x98);
  }
  pTVar7 = local_170->logicType;
  pNVar19 = (NetType *)operator_new(0x98);
  sVar116._M_str = "<error>";
  sVar116._M_len = 7;
  NetType::NetType(pNVar19,Unknown,sVar116,pTVar7);
  local_168._M_len = local_168._M_len & 0xffffffffffff0000;
  uVar52 = (local_170->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  pgVar8 = (local_170->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_;
  ppVar45 = (local_170->knownNetTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
            .arrays.elements_;
  uVar54 = 0;
  uVar18 = 0;
  do {
    pgVar3 = pgVar8 + uVar54;
    auVar70[0] = -(pgVar3->m[0].n == '\b');
    auVar70[1] = -(pgVar3->m[1].n == '\b');
    auVar70[2] = -(pgVar3->m[2].n == '\b');
    auVar70[3] = -(pgVar3->m[3].n == '\b');
    auVar70[4] = -(pgVar3->m[4].n == '\b');
    auVar70[5] = -(pgVar3->m[5].n == '\b');
    auVar70[6] = -(pgVar3->m[6].n == '\b');
    auVar70[7] = -(pgVar3->m[7].n == '\b');
    auVar70[8] = -(pgVar3->m[8].n == '\b');
    auVar70[9] = -(pgVar3->m[9].n == '\b');
    auVar70[10] = -(pgVar3->m[10].n == '\b');
    auVar70[0xb] = -(pgVar3->m[0xb].n == '\b');
    auVar70[0xc] = -(pgVar3->m[0xc].n == '\b');
    auVar70[0xd] = -(pgVar3->m[0xd].n == '\b');
    auVar70[0xe] = -(pgVar3->m[0xe].n == '\b');
    auVar70[0xf] = -(pgVar3->m[0xf].n == '\b');
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar70 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar70 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar70 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar70 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar70 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar70 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar70 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar70 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar70 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar70 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar70 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar70 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar70 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar70 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar70 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(short *)((long)&ppVar45[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0) {
        lVar53 = (long)&ppVar45[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f2e33;
      }
    }
    if ((pgVar8[uVar54].m[0xf].n & 1) == 0) break;
    lVar53 = uVar54 + uVar18;
    uVar18 = uVar18 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar18 <= uVar52);
  lVar53 = 0;
LAB_001f2e33:
  if (lVar53 == 0) {
    if ((local_170->knownNetTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
        .size_ctrl.size <
        (local_170->knownNetTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                  *)local_138,&local_138->arrays,0,0,&local_171,(TokenKind *)&local_168);
      psVar1 = &(local_170->knownNetTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                  *)local_138,0,&local_171,(TokenKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  pvVar9 = *(void **)(lVar53 + 8);
  *(NetType **)(lVar53 + 8) = pNVar19;
  if (pvVar9 != (void *)0x0) {
    operator_delete(pvVar9,0x98);
  }
  local_168._M_len = CONCAT62(local_168._M_len._2_6_,0x14f);
  uVar18 = 0xa9849bd92785fb4 >>
           ((byte)(local_170->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar8 = (local_170->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_;
  ppVar45 = (local_170->knownNetTypes).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
            .arrays.elements_;
  uVar52 = (local_170->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar56 = 0;
  uVar54 = uVar18;
  do {
    pgVar3 = pgVar8 + uVar54;
    auVar71[0] = -(pgVar3->m[0].n == 0xb4);
    auVar71[1] = -(pgVar3->m[1].n == 0xb4);
    auVar71[2] = -(pgVar3->m[2].n == 0xb4);
    auVar71[3] = -(pgVar3->m[3].n == 0xb4);
    auVar71[4] = -(pgVar3->m[4].n == 0xb4);
    auVar71[5] = -(pgVar3->m[5].n == 0xb4);
    auVar71[6] = -(pgVar3->m[6].n == 0xb4);
    auVar71[7] = -(pgVar3->m[7].n == 0xb4);
    auVar71[8] = -(pgVar3->m[8].n == 0xb4);
    auVar71[9] = -(pgVar3->m[9].n == 0xb4);
    auVar71[10] = -(pgVar3->m[10].n == 0xb4);
    auVar71[0xb] = -(pgVar3->m[0xb].n == 0xb4);
    auVar71[0xc] = -(pgVar3->m[0xc].n == 0xb4);
    auVar71[0xd] = -(pgVar3->m[0xd].n == 0xb4);
    auVar71[0xe] = -(pgVar3->m[0xe].n == 0xb4);
    auVar71[0xf] = -(pgVar3->m[0xf].n == 0xb4);
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar71 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar71 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar71 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar71 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar71 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar71 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar71 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar71 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar71 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar71 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar71 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar71 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar71 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar71 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar71 >> 0x77,0) & 1) << 0xe); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      iVar17 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if (*(short *)((long)&ppVar45[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4)) == 0x14f) {
        lVar53 = (long)&ppVar45[uVar54 * 0xf].first + (ulong)(uint)(iVar17 << 4);
        goto LAB_001f2f5e;
      }
    }
    if ((pgVar8[uVar54].m[0xf].n & 0x10) == 0) break;
    lVar53 = uVar54 + uVar56;
    uVar56 = uVar56 + 1;
    uVar54 = lVar53 + 1U & uVar52;
  } while (uVar56 <= uVar52);
  lVar53 = 0;
LAB_001f2f5e:
  if (lVar53 == 0) {
    if ((local_170->knownNetTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
        .size_ctrl.size <
        (local_170->knownNetTypes).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                  *)local_138,&local_138->arrays,uVar18,0xa9849bd92785fb4,&local_171,
                 (TokenKind *)&local_168);
      psVar1 = &(local_170->knownNetTypes).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                  *)local_138,0xa9849bd92785fb4,&local_171,(TokenKind *)&local_168);
    }
    lVar53 = CONCAT44(uStack_144,local_158._16_4_);
  }
  pCVar26 = local_170;
  local_170->wireNetType = *(NetType **)(lVar53 + 8);
  pTVar7 = local_170->bitType;
  bVar16 = Type::getIntegralFlags(pTVar7);
  pCVar26->scalarTypeTable[bVar16.m_bits & 7] = pTVar7;
  pTVar7 = pCVar26->logicType;
  bVar16 = Type::getIntegralFlags(pTVar7);
  pCVar26->scalarTypeTable[bVar16.m_bits & 7] = pTVar7;
  bVar16 = Type::getIntegralFlags((Type *)(ast::builtins::Builtins::Instance + 0xb0));
  pCVar26->scalarTypeTable[bVar16.m_bits & 7] = (Type *)(ast::builtins::Builtins::Instance + 0xb0);
  bVar16 = Type::getIntegralFlags((Type *)(ast::builtins::Builtins::Instance + 0x108));
  pCVar26->scalarTypeTable[bVar16.m_bits & 7] = (Type *)(ast::builtins::Builtins::Instance + 0x108);
  bVar16 = Type::getIntegralFlags((Type *)(ast::builtins::Builtins::Instance + 0x160));
  pCVar26->scalarTypeTable[bVar16.m_bits & 7] = (Type *)(ast::builtins::Builtins::Instance + 0x160);
  bVar16 = Type::getIntegralFlags((Type *)(ast::builtins::Builtins::Instance + 0x1b8));
  pCVar26->scalarTypeTable[bVar16.m_bits & 7] = (Type *)(ast::builtins::Builtins::Instance + 0x1b8);
  thisSym_ = (RootSymbol *)operator_new(0x98);
  (thisSym_->super_Symbol).kind = Root;
  (thisSym_->super_Symbol).name._M_len = 5;
  *(char **)((long)&(thisSym_->super_Symbol).name + 8) = "$root";
  (thisSym_->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (thisSym_->super_Symbol).location = (SourceLocation)0x0;
  (thisSym_->super_Symbol).parentScope = (Scope *)0x0;
  *(undefined1 (*) [16])((long)&(thisSym_->super_Symbol).parentScope + 4) = (undefined1  [16])0x0;
  Scope::Scope(&thisSym_->super_Scope,pCVar26,(Symbol *)thisSym_);
  (thisSym_->compilationUnits)._M_ptr = (pointer)0x0;
  (thisSym_->compilationUnits)._M_extent = 0;
  (thisSym_->topInstances)._M_ptr = (pointer)0x0;
  (thisSym_->topInstances)._M_extent = 0;
  p = (pCVar26->root)._M_t.
      super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>.
      _M_t.
      super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
      .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
  (pCVar26->root)._M_t.
  super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>._M_t.
  super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>.
  super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl = thisSym_;
  if (p != (RootSymbol *)0x0) {
    operator_delete(p,0x98);
  }
  pCVar26 = local_170;
  std::
  vector<std::shared_ptr<slang::ast::SystemSubroutine>,_std::allocator<std::shared_ptr<slang::ast::SystemSubroutine>_>_>
  ::operator=(local_90,(vector<std::shared_ptr<slang::ast::SystemSubroutine>,_std::allocator<std::shared_ptr<slang::ast::SystemSubroutine>_>_>
                        *)(ast::builtins::Builtins::Instance + 0x8d8));
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  ::operator=(local_a0,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
                        *)(ast::builtins::Builtins::Instance + 0x8f0));
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  ::operator=(local_98,(table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
                        *)(ast::builtins::Builtins::Instance + 0x920));
  pPVar20 = ast::builtins::createStdPackage(pCVar26);
  pCVar26->stdPkg = pPVar20;
  local_130 = &(pPVar20->super_Symbol).name;
  local_108 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                        (local_f0,local_130);
  pSVar25 = (SourceLibrary *)
            (local_108 >>
            ((byte)(pCVar26->packageMap).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
                   .arrays.groups_size_index & 0x3f));
  pgVar24 = (pCVar26->packageMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
            .arrays.groups_;
  lVar53 = (local_108 & 0xff) * 4;
  uVar74 = (&UNK_0046cabc)[lVar53];
  uVar101 = (&UNK_0046cabd)[lVar53];
  uVar102 = (&UNK_0046cabe)[lVar53];
  uVar103 = (&UNK_0046cabf)[lVar53];
  local_88 = (pCVar26->packageMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
             .arrays.elements_;
  __n = (pPVar20->super_Symbol).name._M_len;
  __s1 = (pPVar20->super_Symbol).name._M_str;
  uVar52 = (ulong)((uint)local_108 & 7);
  local_70 = (pCVar26->packageMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
             .arrays.groups_size_mask;
  uVar54 = 0;
  uVar104 = uVar74;
  uVar105 = uVar101;
  uVar106 = uVar102;
  uVar107 = uVar103;
  uVar108 = uVar74;
  uVar109 = uVar101;
  uVar110 = uVar102;
  uVar111 = uVar103;
  uVar112 = uVar74;
  uVar113 = uVar101;
  uVar114 = uVar102;
  uVar115 = uVar103;
  local_110 = pSVar25;
  do {
    ppVar46 = local_88;
    pgVar4 = pgVar24 + (long)pSVar25;
    auVar72[0] = -(pgVar4->m[0].n == uVar74);
    auVar72[1] = -(pgVar4->m[1].n == uVar101);
    auVar72[2] = -(pgVar4->m[2].n == uVar102);
    auVar72[3] = -(pgVar4->m[3].n == uVar103);
    auVar72[4] = -(pgVar4->m[4].n == uVar104);
    auVar72[5] = -(pgVar4->m[5].n == uVar105);
    auVar72[6] = -(pgVar4->m[6].n == uVar106);
    auVar72[7] = -(pgVar4->m[7].n == uVar107);
    auVar72[8] = -(pgVar4->m[8].n == uVar108);
    auVar72[9] = -(pgVar4->m[9].n == uVar109);
    auVar72[10] = -(pgVar4->m[10].n == uVar110);
    auVar72[0xb] = -(pgVar4->m[0xb].n == uVar111);
    auVar72[0xc] = -(pgVar4->m[0xc].n == uVar112);
    auVar72[0xd] = -(pgVar4->m[0xd].n == uVar113);
    auVar72[0xe] = -(pgVar4->m[0xe].n == uVar114);
    auVar72[0xf] = -(pgVar4->m[0xf].n == uVar115);
    uVar22 = (uint)(ushort)((ushort)(SUB161(auVar72 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar72 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar72 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar72 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar72 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar72 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar72 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar72 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar72 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar72 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar72 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar72 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar72 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar72 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar72 >> 0x77,0) & 1) << 0xe);
    uVar18 = uVar54;
    uVar56 = (long)pSVar25 * 0x10;
    local_68 = pSVar25;
    if (uVar22 != 0) {
      local_128 = (pointer)CONCAT17(uVar107,CONCAT16(uVar106,CONCAT15(uVar105,CONCAT14(uVar104,
                                                  CONCAT13(uVar103,CONCAT12(uVar102,CONCAT11(uVar101
                                                  ,uVar74)))))));
      uStack_120 = uVar108;
      uStack_11f = uVar109;
      uStack_11e = uVar110;
      uStack_11d = uVar111;
      uStack_11c = uVar112;
      uStack_11b = uVar113;
      uStack_11a = uVar114;
      uStack_119 = uVar115;
      local_e0 = (long)pSVar25 * 0x10;
      local_d8 = uVar54;
      local_d0 = uVar52;
      local_c8 = pgVar24;
      do {
        uVar10 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
          }
        }
        ppVar57 = ppVar46 + (long)pSVar25 * 0xf + (ulong)uVar10;
        bVar59 = __n == (ppVar57->first)._M_len;
        if (bVar59 && __n != 0) {
          iVar17 = bcmp(__s1,(ppVar57->first)._M_str,__n);
          bVar59 = iVar17 == 0;
          uVar74 = (uchar)local_128;
          uVar101 = local_128._1_1_;
          uVar102 = local_128._2_1_;
          uVar103 = local_128._3_1_;
          uVar104 = local_128._4_1_;
          uVar105 = local_128._5_1_;
          uVar106 = local_128._6_1_;
          uVar107 = local_128._7_1_;
          uVar108 = uStack_120;
          uVar109 = uStack_11f;
          uVar110 = uStack_11e;
          uVar111 = uStack_11d;
          uVar112 = uStack_11c;
          uVar113 = uStack_11b;
          uVar114 = uStack_11a;
          uVar115 = uStack_119;
        }
        if (bVar59) goto LAB_001f32fb;
        uVar22 = uVar22 - 1 & uVar22;
        pgVar24 = local_c8;
        uVar52 = local_d0;
        uVar18 = local_d8;
        uVar56 = local_e0;
      } while (uVar22 != 0);
    }
    if ((pgVar24->m[uVar56 + 0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[uVar52]) == 0) break;
    uVar54 = uVar18 + 1;
    pSVar25 = (SourceLibrary *)((long)&(local_68->name)._M_dataplus._M_p + uVar18 + 1 & local_70);
  } while (uVar54 <= local_70);
  ppVar57 = (value_type_pointer)0x0;
LAB_001f32fb:
  if (ppVar57 == (value_type_pointer)0x0) {
    if ((local_170->packageMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
        .size_ctrl.size <
        (local_170->packageMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PackageSymbol_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::PackageSymbol_const*&>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PackageSymbol_const*>>>
                  *)local_f0,(arrays_type *)local_f0,(size_t)local_110,local_108,
                 (try_emplace_args_t *)&local_168,local_130,local_100);
      *(size_t *)local_c0 = *(size_t *)local_c0 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PackageSymbol_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::PackageSymbol_const*&>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PackageSymbol_const*>>>
                  *)local_f0,local_108,(try_emplace_args_t *)&local_168,local_130,local_100);
    }
  }
  pCVar26 = local_170;
  ast::builtins::registerGateTypes(local_170);
  if (pCVar26->defaultLibPtr == (SourceLibrary *)0x0) {
    pgVar5 = (group15<boost::unordered::detail::foa::plain_integral> *)(local_158 + 0x10);
    local_158._16_4_ = 0x6b726f77;
    local_158._8_8_ = 4;
    uStack_144 = uStack_144 & 0xffffff00;
    local_158._0_8_ = pgVar5;
    plVar21 = (long *)operator_new(0x40);
    *plVar21 = (long)(plVar21 + 2);
    plVar21[2] = CONCAT44(uStack_144,local_158._16_4_);
    plVar21[3] = lStack_140;
    plVar21[1] = 4;
    local_158._8_8_ = 0;
    local_158._16_4_ = local_158._16_4_ & 0xffffff00;
    plVar21[6] = 0;
    *(undefined1 (*) [16])(plVar21 + 4) = (undefined1  [16])0x0;
    *(undefined4 *)(plVar21 + 7) = 0x7fffffff;
    *(undefined1 *)((long)plVar21 + 0x3c) = 0;
    local_168._M_len = 0;
    pSVar25 = *(SourceLibrary **)local_b8;
    *(long **)local_b8 = plVar21;
    local_158._0_8_ = pgVar5;
    if (pSVar25 != (SourceLibrary *)0x0) {
      std::default_delete<slang::SourceLibrary>::operator()(local_b8,pSVar25);
    }
    if ((SourceLibrary *)local_168._M_len != (SourceLibrary *)0x0) {
      std::default_delete<slang::SourceLibrary>::operator()
                ((default_delete<slang::SourceLibrary> *)&local_168,
                 (SourceLibrary *)local_168._M_len);
    }
    local_168._M_len = 0;
    if ((group15<boost::unordered::detail::foa::plain_integral> *)local_158._0_8_ != pgVar5) {
      operator_delete((void *)local_158._0_8_,CONCAT44(uStack_144,local_158._16_4_) + 1);
    }
    pSVar25 = (local_170->defaultLibMem)._M_t.
              super___uniq_ptr_impl<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>
              ._M_t.
              super__Tuple_impl<0UL,_slang::SourceLibrary_*,_std::default_delete<slang::SourceLibrary>_>
              .super__Head_base<0UL,_slang::SourceLibrary_*,_false>._M_head_impl;
    pSVar25->isDefault = true;
    local_170->defaultLibPtr = pSVar25;
    pCVar26 = local_170;
  }
  pSVar25 = pCVar26->defaultLibPtr;
  local_168._M_str = (pSVar25->name)._M_dataplus._M_p;
  local_168._M_len = (pSVar25->name)._M_string_length;
  local_130 = (basic_string_view<char,_std::char_traits<char>_> *)
              hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                        (local_f8,&local_168);
  sVar23 = local_168._M_len;
  uVar54 = (ulong)local_130 >>
           ((byte)(pCVar26->libraryNameMap).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar24 = (pCVar26->libraryNameMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
            .arrays.groups_;
  lVar53 = ((ulong)local_130 & 0xff) * 4;
  uVar74 = (&UNK_0046cabc)[lVar53];
  uVar101 = (&UNK_0046cabd)[lVar53];
  uVar102 = (&UNK_0046cabe)[lVar53];
  uVar103 = (&UNK_0046cabf)[lVar53];
  local_c0 = (pCVar26->libraryNameMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
             .arrays.elements_;
  local_128 = local_168._M_str;
  local_100 = (PackageSymbol **)(ulong)((uint)local_130 & 7);
  uVar52 = (pCVar26->libraryNameMap).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
           .arrays.groups_size_mask;
  uVar18 = 0;
  uVar104 = uVar74;
  uVar105 = uVar101;
  uVar106 = uVar102;
  uVar107 = uVar103;
  uVar108 = uVar74;
  uVar109 = uVar101;
  uVar110 = uVar102;
  uVar111 = uVar103;
  uVar112 = uVar74;
  uVar113 = uVar101;
  uVar114 = uVar102;
  uVar115 = uVar103;
  local_108 = uVar54;
  do {
    ppVar38 = local_c0;
    pgVar4 = pgVar24 + uVar54;
    auVar73[0] = -(pgVar4->m[0].n == uVar74);
    auVar73[1] = -(pgVar4->m[1].n == uVar101);
    auVar73[2] = -(pgVar4->m[2].n == uVar102);
    auVar73[3] = -(pgVar4->m[3].n == uVar103);
    auVar73[4] = -(pgVar4->m[4].n == uVar104);
    auVar73[5] = -(pgVar4->m[5].n == uVar105);
    auVar73[6] = -(pgVar4->m[6].n == uVar106);
    auVar73[7] = -(pgVar4->m[7].n == uVar107);
    auVar73[8] = -(pgVar4->m[8].n == uVar108);
    auVar73[9] = -(pgVar4->m[9].n == uVar109);
    auVar73[10] = -(pgVar4->m[10].n == uVar110);
    auVar73[0xb] = -(pgVar4->m[0xb].n == uVar111);
    auVar73[0xc] = -(pgVar4->m[0xc].n == uVar112);
    auVar73[0xd] = -(pgVar4->m[0xd].n == uVar113);
    auVar73[0xe] = -(pgVar4->m[0xe].n == uVar114);
    auVar73[0xf] = -(pgVar4->m[0xf].n == uVar115);
    uVar22 = (uint)(ushort)((ushort)(SUB161(auVar73 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar73 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar73 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar73 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar73 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar73 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar73 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar73 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar73 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar73 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar73 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar73 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar73 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar73 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar73 >> 0x77,0) & 1) << 0xe);
    uVar56 = uVar54;
    uVar55 = uVar18;
    if (uVar22 != 0) {
      local_88 = (value_type_pointer)
                 CONCAT17(uVar107,CONCAT16(uVar106,CONCAT15(uVar105,CONCAT14(uVar104,CONCAT13(
                                                  uVar103,CONCAT12(uVar102,CONCAT11(uVar101,uVar74))
                                                  )))));
      local_110 = pSVar25;
      local_e0 = uVar18;
      local_d8 = uVar54;
      local_d0 = uVar52;
      local_c8 = pgVar24;
      uStack_80 = uVar108;
      uStack_7f = uVar109;
      uStack_7e = uVar110;
      uStack_7d = uVar111;
      uStack_7c = uVar112;
      uStack_7b = uVar113;
      uStack_7a = uVar114;
      uStack_79 = uVar115;
      do {
        uVar10 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
          }
        }
        ppVar58 = ppVar38 + uVar54 * 0xf + (ulong)uVar10;
        bVar59 = sVar23 == (ppVar58->first)._M_len;
        if (bVar59 && sVar23 != 0) {
          iVar17 = bcmp(local_128,(ppVar58->first)._M_str,sVar23);
          bVar59 = iVar17 == 0;
          uVar74 = (uchar)local_88;
          uVar101 = local_88._1_1_;
          uVar102 = local_88._2_1_;
          uVar103 = local_88._3_1_;
          uVar104 = local_88._4_1_;
          uVar105 = local_88._5_1_;
          uVar106 = local_88._6_1_;
          uVar107 = local_88._7_1_;
          uVar108 = uStack_80;
          uVar109 = uStack_7f;
          uVar110 = uStack_7e;
          uVar111 = uStack_7d;
          uVar112 = uStack_7c;
          uVar113 = uStack_7b;
          uVar114 = uStack_7a;
          uVar115 = uStack_79;
        }
        pSVar25 = local_110;
        if (bVar59) goto LAB_001f361e;
        uVar22 = uVar22 - 1 & uVar22;
        pgVar24 = local_c8;
        uVar56 = local_d8;
        uVar52 = local_d0;
        uVar55 = local_e0;
      } while (uVar22 != 0);
    }
    if ((pgVar24[uVar54].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(long)local_100]) == 0) break;
    uVar18 = uVar55 + 1;
    uVar54 = uVar56 + uVar55 + 1 & uVar52;
  } while (uVar18 <= uVar52);
  ppVar58 = (value_type_pointer)0x0;
LAB_001f361e:
  if (ppVar58 == (value_type_pointer)0x0) {
    if ((local_170->libraryNameMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
        .size_ctrl.size <
        (local_170->libraryNameMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
                  *)local_f8,(arrays_type *)local_f8,local_108,(size_t)local_130,&local_171,
                 &local_168);
      psVar1 = &(local_170->libraryNameMap).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                ((locator *)local_158,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
                  *)local_f8,(size_t)local_130,&local_171,&local_168);
    }
    ppVar58 = (value_type_pointer)CONCAT44(uStack_144,local_158._16_4_);
  }
  ppVar58->second = pSVar25;
  *in_FS_OFFSET = (long)local_158;
  *in_FS_OFFSET =
       (long)std::once_flag::_Prepare_execution::
             _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
             ::anon_class_1_0_00000001::__invoke;
  local_158._0_8_ = &local_168;
  iVar17 = pthread_once(&Compilation::onceFlag._M_once,__once_proxy);
  if (iVar17 != 0) {
    std::__throw_system_error(iVar17);
  }
  *in_FS_OFFSET = 0;
  *in_FS_OFFSET = 0;
  local_170->nextEnumSystemId = 1;
  local_170->nextStructSystemId = 1;
  local_170->nextUnionSystemId = 1;
  return;
}

Assistant:

Compilation::Compilation(const Bag& options, const SourceLibrary* defaultLib) :
    options(options.getOrDefault<CompilationOptions>()), driverMapAllocator(*this),
    unrollIntervalMapAllocator(*this), tempDiag({}, {}), netAliasAllocator(*this),
    defaultLibPtr(defaultLib) {

    // Construct all built-in types.
    auto& bi = slang::ast::builtins::Builtins::Instance;
    bitType = &bi.bitType;
    logicType = &bi.logicType;
    intType = &bi.intType;
    byteType = &bi.byteType;
    integerType = &bi.integerType;
    realType = &bi.realType;
    shortRealType = &bi.shortRealType;
    stringType = &bi.stringType;
    voidType = &bi.voidType;
    errorType = &bi.errorType;

    auto regType = &bi.regType;
    auto signedBitType = &bi.signedBitType;
    auto signedLogicType = &bi.signedLogicType;
    auto signedRegType = &bi.signedRegType;
    auto shortIntType = &bi.shortIntType;
    auto longIntType = &bi.longIntType;
    auto timeType = &bi.timeType;
    auto realTimeType = &bi.realTimeType;
    auto chandleType = &bi.chandleType;
    auto nullType = &bi.nullType;
    auto eventType = &bi.eventType;
    auto unboundedType = &bi.unboundedType;
    auto typeRefType = &bi.typeRefType;
    auto untypedType = &bi.untypedType;
    auto sequenceType = &bi.sequenceType;
    auto propertyType = &bi.propertyType;

    // Register built-in types for lookup by syntax kind.
    knownTypes.reserve(32);
    knownTypes[SyntaxKind::ShortIntType] = shortIntType;
    knownTypes[SyntaxKind::IntType] = intType;
    knownTypes[SyntaxKind::LongIntType] = longIntType;
    knownTypes[SyntaxKind::ByteType] = byteType;
    knownTypes[SyntaxKind::BitType] = bitType;
    knownTypes[SyntaxKind::LogicType] = logicType;
    knownTypes[SyntaxKind::RegType] = regType;
    knownTypes[SyntaxKind::IntegerType] = integerType;
    knownTypes[SyntaxKind::TimeType] = timeType;
    knownTypes[SyntaxKind::RealType] = realType;
    knownTypes[SyntaxKind::RealTimeType] = realTimeType;
    knownTypes[SyntaxKind::ShortRealType] = shortRealType;
    knownTypes[SyntaxKind::StringType] = stringType;
    knownTypes[SyntaxKind::CHandleType] = chandleType;
    knownTypes[SyntaxKind::NullLiteralExpression] = nullType;
    knownTypes[SyntaxKind::VoidType] = voidType;
    knownTypes[SyntaxKind::EventType] = eventType;
    knownTypes[SyntaxKind::WildcardLiteralExpression] = unboundedType;
    knownTypes[SyntaxKind::TypeReference] = typeRefType;
    knownTypes[SyntaxKind::Untyped] = untypedType;
    knownTypes[SyntaxKind::SequenceType] = sequenceType;
    knownTypes[SyntaxKind::PropertyType] = propertyType;
    knownTypes[SyntaxKind::Unknown] = errorType;

#define MAKE_NETTYPE(type)                                               \
    knownNetTypes[TokenKind::type##Keyword] = std::make_unique<NetType>( \
        NetType::type, LexerFacts::getTokenKindText(TokenKind::type##Keyword), *logicType)

    knownNetTypes.reserve(16);
    MAKE_NETTYPE(Wire);
    MAKE_NETTYPE(WAnd);
    MAKE_NETTYPE(WOr);
    MAKE_NETTYPE(Tri);
    MAKE_NETTYPE(TriAnd);
    MAKE_NETTYPE(TriOr);
    MAKE_NETTYPE(Tri0);
    MAKE_NETTYPE(Tri1);
    MAKE_NETTYPE(TriReg);
    MAKE_NETTYPE(Supply0);
    MAKE_NETTYPE(Supply1);
    MAKE_NETTYPE(UWire);
    MAKE_NETTYPE(Interconnect);

    knownNetTypes[TokenKind::Unknown] = std::make_unique<NetType>(NetType::Unknown, "<error>",
                                                                  *logicType);
    wireNetType = knownNetTypes[TokenKind::WireKeyword].get();

#undef MAKE_NETTYPE

    // Scalar types are indexed by bit flags.
    auto registerScalar = [this](auto type) {
        scalarTypeTable[type->getIntegralFlags().bits() & 0x7] = type;
    };
    registerScalar(bitType);
    registerScalar(logicType);
    registerScalar(regType);
    registerScalar(signedBitType);
    registerScalar(signedLogicType);
    registerScalar(signedRegType);

    root = std::make_unique<RootSymbol>(*this);

    // Copy in all built-in system tasks, functions, and methods.
    systemSubroutines = bi.systemSubroutines;
    subroutineNameMap = bi.subroutineNameMap;
    methodMap = bi.methodMap;

    // Register the built-in std package.
    stdPkg = &builtins::createStdPackage(*this);
    packageMap.emplace(stdPkg->name, stdPkg);

    // Register the built-in gate types.
    builtins::registerGateTypes(*this);

    // Register the default library.
    if (defaultLibPtr) {
        SLANG_ASSERT(defaultLibPtr->isDefault);
    }
    else {
        defaultLibMem = std::make_unique<SourceLibrary>("work"s, INT_MAX);
        defaultLibMem->isDefault = true;
        defaultLibPtr = defaultLibMem.get();
    }
    libraryNameMap[defaultLibPtr->name] = defaultLibPtr;

    // Set a default handler for printing types and symbol paths, for convenience.
    static std::once_flag onceFlag;
    std::call_once(onceFlag, [] {
        DiagnosticEngine::setDefaultFormatter<const Type*>(std::make_unique<TypeArgFormatter>());
        DiagnosticEngine::setDefaultSymbolPathCB(
            [](const Symbol& sym) { return sym.getHierarchicalPath(); });
    });

    // Reset systemId counters that may have been changed due to creation of types
    // in the std package.
    nextEnumSystemId = 1;
    nextStructSystemId = 1;
    nextUnionSystemId = 1;
}